

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  int iVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  byte bVar79;
  byte bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  long lVar84;
  uint uVar85;
  long lVar86;
  ulong uVar87;
  byte bVar88;
  ulong uVar89;
  float fVar90;
  float fVar91;
  float fVar141;
  float fVar143;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar145;
  float fVar148;
  float fVar149;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined4 uVar150;
  undefined8 uVar151;
  vint4 bi_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  vint4 bi;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar180;
  float fVar188;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  float fVar189;
  float fVar196;
  float fVar197;
  vint4 ai_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar198;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vint4 ai;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  Precalculations *local_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  RTCFilterFunctionNArguments local_680;
  undefined1 local_650 [16];
  uint local_640;
  undefined4 uStack_63c;
  undefined8 uStack_638;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  LinearSpace3fa *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  byte local_2f0;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  int local_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar81 = (ulong)(byte)PVar6;
  lVar30 = uVar81 * 0x25;
  fVar189 = *(float *)(prim + lVar30 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + lVar30 + 6));
  auVar181._0_4_ = fVar189 * auVar96._0_4_;
  auVar181._4_4_ = fVar189 * auVar96._4_4_;
  auVar181._8_4_ = fVar189 * auVar96._8_4_;
  auVar181._12_4_ = fVar189 * auVar96._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar152._0_4_ = fVar189 * auVar95._0_4_;
  auVar152._4_4_ = fVar189 * auVar95._4_4_;
  auVar152._8_4_ = fVar189 * auVar95._8_4_;
  auVar152._12_4_ = fVar189 * auVar95._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 6)));
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar81 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar199._4_4_ = auVar152._0_4_;
  auVar199._0_4_ = auVar152._0_4_;
  auVar199._8_4_ = auVar152._0_4_;
  auVar199._12_4_ = auVar152._0_4_;
  auVar97 = vshufps_avx(auVar152,auVar152,0x55);
  auVar98 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar189 = auVar98._0_4_;
  auVar171._0_4_ = fVar189 * auVar229._0_4_;
  fVar196 = auVar98._4_4_;
  auVar171._4_4_ = fVar196 * auVar229._4_4_;
  fVar197 = auVar98._8_4_;
  auVar171._8_4_ = fVar197 * auVar229._8_4_;
  fVar198 = auVar98._12_4_;
  auVar171._12_4_ = fVar198 * auVar229._12_4_;
  auVar166._0_4_ = auVar25._0_4_ * fVar189;
  auVar166._4_4_ = auVar25._4_4_ * fVar196;
  auVar166._8_4_ = auVar25._8_4_ * fVar197;
  auVar166._12_4_ = auVar25._12_4_ * fVar198;
  auVar153._0_4_ = auVar28._0_4_ * fVar189;
  auVar153._4_4_ = auVar28._4_4_ * fVar196;
  auVar153._8_4_ = auVar28._8_4_ * fVar197;
  auVar153._12_4_ = auVar28._12_4_ * fVar198;
  auVar98 = vfmadd231ps_fma(auVar171,auVar97,auVar95);
  auVar32 = vfmadd231ps_fma(auVar166,auVar97,auVar24);
  auVar97 = vfmadd231ps_fma(auVar153,auVar27,auVar97);
  auVar33 = vfmadd231ps_fma(auVar98,auVar199,auVar96);
  auVar32 = vfmadd231ps_fma(auVar32,auVar199,auVar23);
  auVar99 = vfmadd231ps_fma(auVar97,auVar26,auVar199);
  auVar222._4_4_ = auVar181._0_4_;
  auVar222._0_4_ = auVar181._0_4_;
  auVar222._8_4_ = auVar181._0_4_;
  auVar222._12_4_ = auVar181._0_4_;
  auVar97 = vshufps_avx(auVar181,auVar181,0x55);
  auVar98 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar189 = auVar98._0_4_;
  auVar200._0_4_ = fVar189 * auVar229._0_4_;
  fVar196 = auVar98._4_4_;
  auVar200._4_4_ = fVar196 * auVar229._4_4_;
  fVar197 = auVar98._8_4_;
  auVar200._8_4_ = fVar197 * auVar229._8_4_;
  fVar198 = auVar98._12_4_;
  auVar200._12_4_ = fVar198 * auVar229._12_4_;
  auVar190._0_4_ = auVar25._0_4_ * fVar189;
  auVar190._4_4_ = auVar25._4_4_ * fVar196;
  auVar190._8_4_ = auVar25._8_4_ * fVar197;
  auVar190._12_4_ = auVar25._12_4_ * fVar198;
  auVar182._0_4_ = auVar28._0_4_ * fVar189;
  auVar182._4_4_ = auVar28._4_4_ * fVar196;
  auVar182._8_4_ = auVar28._8_4_ * fVar197;
  auVar182._12_4_ = auVar28._12_4_ * fVar198;
  auVar95 = vfmadd231ps_fma(auVar200,auVar97,auVar95);
  auVar229 = vfmadd231ps_fma(auVar190,auVar97,auVar24);
  auVar24 = vfmadd231ps_fma(auVar182,auVar97,auVar27);
  auVar34 = vfmadd231ps_fma(auVar95,auVar222,auVar96);
  auVar152 = vfmadd231ps_fma(auVar229,auVar222,auVar23);
  auVar213._8_4_ = 0x7fffffff;
  auVar213._0_8_ = 0x7fffffff7fffffff;
  auVar213._12_4_ = 0x7fffffff;
  auVar153 = vfmadd231ps_fma(auVar24,auVar222,auVar26);
  auVar96 = vandps_avx(auVar213,auVar33);
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar96,auVar210,1);
  bVar16 = (bool)((byte)uVar87 & 1);
  auVar92._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._0_4_;
  bVar16 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._4_4_;
  bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._8_4_;
  bVar16 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar33._12_4_;
  auVar96 = vandps_avx(auVar213,auVar32);
  uVar87 = vcmpps_avx512vl(auVar96,auVar210,1);
  bVar16 = (bool)((byte)uVar87 & 1);
  auVar93._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar32._0_4_;
  bVar16 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar32._4_4_;
  bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar32._8_4_;
  bVar16 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar32._12_4_;
  auVar96 = vandps_avx(auVar213,auVar99);
  uVar87 = vcmpps_avx512vl(auVar96,auVar210,1);
  bVar16 = (bool)((byte)uVar87 & 1);
  auVar94._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar99._0_4_;
  bVar16 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar99._4_4_;
  bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar99._8_4_;
  bVar16 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar99._12_4_;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = &DAT_3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar92,auVar95,auVar211);
  auVar33 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar96 = vfnmadd213ps_fma(auVar93,auVar95,auVar211);
  auVar99 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar96 = vfnmadd213ps_fma(auVar94,auVar95,auVar211);
  auVar31 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  fVar189 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar208._4_4_ = fVar189;
  auVar208._0_4_ = fVar189;
  auVar208._8_4_ = fVar189;
  auVar208._12_4_ = fVar189;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar23 = vsubps_avx(auVar95,auVar96);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar95 = vpmovsxwd_avx(auVar229);
  auVar229 = vfmadd213ps_fma(auVar23,auVar208,auVar96);
  auVar96 = vcvtdq2ps_avx(auVar95);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar95 = vpmovsxwd_avx(auVar23);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar23 = vfmadd213ps_fma(auVar95,auVar208,auVar96);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar96 = vpmovsxwd_avx(auVar24);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar87 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar81 * 2 + uVar87 + 6);
  auVar95 = vpmovsxwd_avx(auVar25);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar24 = vfmadd213ps_fma(auVar95,auVar208,auVar96);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar96 = vpmovsxwd_avx(auVar26);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 6);
  auVar95 = vpmovsxwd_avx(auVar27);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar25 = vfmadd213ps_fma(auVar95,auVar208,auVar96);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 6);
  auVar96 = vpmovsxwd_avx(auVar28);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar81 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar95 = vpmovsxwd_avx(auVar97);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar26 = vfmadd213ps_fma(auVar95,auVar208,auVar96);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar81) + 6);
  auVar96 = vpmovsxwd_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 6);
  auVar95 = vpmovsxwd_avx(auVar32);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar95 = vfmadd213ps_fma(auVar95,auVar208,auVar96);
  auVar96 = vsubps_avx(auVar229,auVar34);
  auVar209._0_4_ = auVar33._0_4_ * auVar96._0_4_;
  auVar209._4_4_ = auVar33._4_4_ * auVar96._4_4_;
  auVar209._8_4_ = auVar33._8_4_ * auVar96._8_4_;
  auVar209._12_4_ = auVar33._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar23,auVar34);
  auVar172._0_4_ = auVar33._0_4_ * auVar96._0_4_;
  auVar172._4_4_ = auVar33._4_4_ * auVar96._4_4_;
  auVar172._8_4_ = auVar33._8_4_ * auVar96._8_4_;
  auVar172._12_4_ = auVar33._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar24,auVar152);
  auVar201._0_4_ = auVar99._0_4_ * auVar96._0_4_;
  auVar201._4_4_ = auVar99._4_4_ * auVar96._4_4_;
  auVar201._8_4_ = auVar99._8_4_ * auVar96._8_4_;
  auVar201._12_4_ = auVar99._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar25,auVar152);
  auVar167._0_4_ = auVar99._0_4_ * auVar96._0_4_;
  auVar167._4_4_ = auVar99._4_4_ * auVar96._4_4_;
  auVar167._8_4_ = auVar99._8_4_ * auVar96._8_4_;
  auVar167._12_4_ = auVar99._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar26,auVar153);
  auVar191._0_4_ = auVar31._0_4_ * auVar96._0_4_;
  auVar191._4_4_ = auVar31._4_4_ * auVar96._4_4_;
  auVar191._8_4_ = auVar31._8_4_ * auVar96._8_4_;
  auVar191._12_4_ = auVar31._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar95,auVar153);
  auVar154._0_4_ = auVar31._0_4_ * auVar96._0_4_;
  auVar154._4_4_ = auVar31._4_4_ * auVar96._4_4_;
  auVar154._8_4_ = auVar31._8_4_ * auVar96._8_4_;
  auVar154._12_4_ = auVar31._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar209,auVar172);
  auVar95 = vpminsd_avx(auVar201,auVar167);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95 = vpminsd_avx(auVar191,auVar154);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar33._4_4_ = uVar150;
  auVar33._0_4_ = uVar150;
  auVar33._8_4_ = uVar150;
  auVar33._12_4_ = uVar150;
  auVar95 = vmaxps_avx512vl(auVar95,auVar33);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar96,auVar99);
  auVar96 = vpmaxsd_avx(auVar209,auVar172);
  auVar95 = vpmaxsd_avx(auVar201,auVar167);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar95 = vpmaxsd_avx(auVar191,auVar154);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar31._4_4_ = uVar150;
  auVar31._0_4_ = uVar150;
  auVar31._8_4_ = uVar150;
  auVar31._12_4_ = uVar150;
  auVar95 = vminps_avx512vl(auVar95,auVar31);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar34._8_4_ = 0x3f800003;
  auVar34._0_8_ = 0x3f8000033f800003;
  auVar34._12_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar34);
  auVar95 = vpbroadcastd_avx512vl();
  uVar151 = vcmpps_avx512vl(local_170,auVar96,2);
  uVar87 = vpcmpgtd_avx512vl(auVar95,_DAT_01ff0cf0);
  uVar87 = ((byte)uVar151 & 0xf) & uVar87;
  if ((char)uVar87 != '\0') {
    local_528 = pre->ray_space + k;
    local_3d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6a8 = pre;
    do {
      lVar30 = 0;
      for (uVar81 = uVar87; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      uVar8 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar7].ptr;
      uVar81 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               (ulong)uVar8 *
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar189 = (pGVar11->time_range).lower;
      fVar189 = pGVar11->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar189) /
                ((pGVar11->time_range).upper - fVar189));
      auVar96 = vroundss_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),9);
      auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
      fVar189 = fVar189 - auVar96._0_4_;
      fVar196 = 1.0 - fVar189;
      _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar86 = (long)(int)auVar96._0_4_ * 0x38;
      lVar84 = *(long *)(_Var12 + 0x10 + lVar86);
      lVar13 = *(long *)(_Var12 + 0x38 + lVar86);
      lVar14 = *(long *)(_Var12 + 0x48 + lVar86);
      auVar155._4_4_ = fVar189;
      auVar155._0_4_ = fVar189;
      auVar155._8_4_ = fVar189;
      auVar155._12_4_ = fVar189;
      pfVar3 = (float *)(lVar13 + lVar14 * uVar81);
      auVar214._0_4_ = fVar189 * *pfVar3;
      auVar214._4_4_ = fVar189 * pfVar3[1];
      auVar214._8_4_ = fVar189 * pfVar3[2];
      auVar214._12_4_ = fVar189 * pfVar3[3];
      lVar30 = uVar81 + 1;
      auVar96 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar13 + lVar14 * lVar30));
      p_Var15 = pGVar11[4].occlusionFilterN;
      auVar168._4_4_ = fVar196;
      auVar168._0_4_ = fVar196;
      auVar168._8_4_ = fVar196;
      auVar168._12_4_ = fVar196;
      local_690 = vfmadd231ps_fma(auVar214,auVar168,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var12 + lVar86) + lVar84 * uVar81));
      _local_610 = vfmadd231ps_avx512vl
                             (auVar96,auVar168,
                              *(undefined1 (*) [16])(*(long *)(_Var12 + lVar86) + lVar84 * lVar30));
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar86 + 0x38) +
                        uVar81 * *(long *)(p_Var15 + lVar86 + 0x48));
      auVar215._0_4_ = fVar189 * *pfVar3;
      auVar215._4_4_ = fVar189 * pfVar3[1];
      auVar215._8_4_ = fVar189 * pfVar3[2];
      auVar215._12_4_ = fVar189 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar86 + 0x38) +
                        *(long *)(p_Var15 + lVar86 + 0x48) * lVar30);
      auVar218._0_4_ = fVar189 * *pfVar3;
      auVar218._4_4_ = fVar189 * pfVar3[1];
      auVar218._8_4_ = fVar189 * pfVar3[2];
      auVar218._12_4_ = fVar189 * pfVar3[3];
      auVar95 = vfmadd231ps_fma(auVar215,auVar168,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var15 + lVar86) +
                                 *(long *)(p_Var15 + lVar86 + 0x10) * uVar81));
      auVar229 = vfmadd231ps_fma(auVar218,auVar168,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var15 + lVar86) +
                                  *(long *)(p_Var15 + lVar86 + 0x10) * lVar30));
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar30 = (long)iVar9 * 0x44;
      auVar169._8_4_ = 0xbeaaaaab;
      auVar169._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar169._12_4_ = 0xbeaaaaab;
      local_620 = vfnmadd213ps_fma(auVar95,auVar169,local_690);
      local_630 = vfmadd213ps_avx512vl(auVar229,auVar169,_local_610);
      auVar229 = vsubps_avx(local_690,auVar96);
      uVar150 = auVar229._0_4_;
      auVar173._4_4_ = uVar150;
      auVar173._0_4_ = uVar150;
      auVar173._8_4_ = uVar150;
      auVar173._12_4_ = uVar150;
      auVar95 = vshufps_avx(auVar229,auVar229,0x55);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar189 = (local_528->vz).field_0.m128[0];
      fVar196 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar197 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar198 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar229 = vshufps_avx(auVar229,auVar229,0xaa);
      auVar217._0_4_ = fVar189 * auVar229._0_4_;
      auVar217._4_4_ = fVar196 * auVar229._4_4_;
      auVar217._8_4_ = fVar197 * auVar229._8_4_;
      auVar217._12_4_ = fVar198 * auVar229._12_4_;
      auVar95 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar95);
      auVar23 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar173);
      auVar229 = vsubps_avx(local_620,auVar96);
      uVar150 = auVar229._0_4_;
      auVar174._4_4_ = uVar150;
      auVar174._0_4_ = uVar150;
      auVar174._8_4_ = uVar150;
      auVar174._12_4_ = uVar150;
      auVar95 = vshufps_avx(auVar229,auVar229,0x55);
      auVar229 = vshufps_avx(auVar229,auVar229,0xaa);
      auVar219._0_4_ = fVar189 * auVar229._0_4_;
      auVar219._4_4_ = fVar196 * auVar229._4_4_;
      auVar219._8_4_ = fVar197 * auVar229._8_4_;
      auVar219._12_4_ = fVar198 * auVar229._12_4_;
      auVar95 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar95);
      auVar24 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar174);
      auVar229 = vsubps_avx(local_630,auVar96);
      uVar150 = auVar229._0_4_;
      auVar175._4_4_ = uVar150;
      auVar175._0_4_ = uVar150;
      auVar175._8_4_ = uVar150;
      auVar175._12_4_ = uVar150;
      auVar95 = vshufps_avx(auVar229,auVar229,0x55);
      auVar229 = vshufps_avx(auVar229,auVar229,0xaa);
      auVar220._0_4_ = fVar189 * auVar229._0_4_;
      auVar220._4_4_ = fVar196 * auVar229._4_4_;
      auVar220._8_4_ = fVar197 * auVar229._8_4_;
      auVar220._12_4_ = fVar198 * auVar229._12_4_;
      auVar95 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar95);
      auVar229 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar175);
      auVar95 = vsubps_avx512vl(_local_610,auVar96);
      uVar150 = auVar95._0_4_;
      auVar170._4_4_ = uVar150;
      auVar170._0_4_ = uVar150;
      auVar170._8_4_ = uVar150;
      auVar170._12_4_ = uVar150;
      auVar96 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar223._0_4_ = fVar189 * auVar95._0_4_;
      auVar223._4_4_ = fVar196 * auVar95._4_4_;
      auVar223._8_4_ = fVar197 * auVar95._8_4_;
      auVar223._12_4_ = fVar198 * auVar95._12_4_;
      auVar96 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar96);
      auVar25 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar170);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar30);
      uVar150 = auVar23._0_4_;
      local_480._4_4_ = uVar150;
      local_480._0_4_ = uVar150;
      local_480._8_4_ = uVar150;
      local_480._12_4_ = uVar150;
      local_480._16_4_ = uVar150;
      local_480._20_4_ = uVar150;
      local_480._24_4_ = uVar150;
      local_480._28_4_ = uVar150;
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x484);
      auVar102._8_4_ = 1;
      auVar102._0_8_ = 0x100000001;
      auVar102._12_4_ = 1;
      auVar102._16_4_ = 1;
      auVar102._20_4_ = 1;
      auVar102._24_4_ = 1;
      auVar102._28_4_ = 1;
      local_400 = vpermps_avx2(auVar102,ZEXT1632(auVar23));
      local_4a0 = vbroadcastss_avx512vl(auVar24);
      local_420 = vpermps_avx512vl(auVar102,ZEXT1632(auVar24));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar229);
      local_4e0 = vpermps_avx512vl(auVar102,ZEXT1632(auVar229));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0xd8c);
      uVar150 = auVar25._0_4_;
      local_440._4_4_ = uVar150;
      local_440._0_4_ = uVar150;
      local_440._8_4_ = uVar150;
      local_440._12_4_ = uVar150;
      local_440._16_4_ = uVar150;
      local_440._20_4_ = uVar150;
      local_440._24_4_ = uVar150;
      local_440._28_4_ = uVar150;
      local_460 = vpermps_avx2(auVar102,ZEXT1632(auVar25));
      auVar102 = vmulps_avx512vl(local_440,auVar114);
      auVar103 = vmulps_avx512vl(local_460,auVar114);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_4c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_4e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar119,local_4a0);
      auVar104 = vfmadd231ps_avx512vl(auVar103,auVar119,local_420);
      auVar105 = vfmadd231ps_avx512vl(auVar102,auVar117,local_480);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar30);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x484);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x908);
      auVar106 = vfmadd231ps_avx512vl(auVar104,auVar117,local_400);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0xd8c);
      auVar235 = ZEXT3264(local_440);
      auVar107 = vmulps_avx512vl(local_440,auVar104);
      auVar236 = ZEXT3264(local_460);
      auVar108 = vmulps_avx512vl(local_460,auVar104);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_4c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_4e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_4a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_420);
      auVar26 = vfmadd231ps_fma(auVar107,auVar102,local_480);
      auVar27 = vfmadd231ps_fma(auVar108,auVar102,local_400);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar26),auVar105);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar27),auVar106);
      auVar107 = vmulps_avx512vl(auVar106,auVar108);
      auVar110 = vmulps_avx512vl(auVar105,auVar109);
      auVar107 = vsubps_avx512vl(auVar107,auVar110);
      auVar96 = vshufps_avx(local_690,local_690,0xff);
      uVar151 = auVar96._0_8_;
      local_80._8_8_ = uVar151;
      local_80._0_8_ = uVar151;
      local_80._16_8_ = uVar151;
      local_80._24_8_ = uVar151;
      auVar96 = vshufps_avx(local_620,local_620,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx(local_630,local_630,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx512vl(_local_610,_local_610,0xff);
      uVar151 = auVar96._0_8_;
      register0x00001248 = uVar151;
      local_e0 = uVar151;
      register0x00001250 = uVar151;
      register0x00001258 = uVar151;
      auVar110 = vmulps_avx512vl(_local_e0,auVar114);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_c0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar119,local_a0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_80);
      auVar111 = vmulps_avx512vl(_local_e0,auVar104);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar113,local_c0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,local_a0);
      auVar28 = vfmadd231ps_fma(auVar111,auVar102,local_80);
      auVar111 = vmulps_avx512vl(auVar109,auVar109);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
      auVar112 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar28));
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar111 = vmulps_avx512vl(auVar112,auVar111);
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      uVar151 = vcmpps_avx512vl(auVar107,auVar111,2);
      auVar96 = vblendps_avx(auVar23,local_690,8);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar96,auVar97);
      auVar96 = vblendps_avx(auVar24,local_620,8);
      auVar96 = vandps_avx512vl(auVar96,auVar97);
      auVar95 = vmaxps_avx(auVar95,auVar96);
      auVar96 = vblendps_avx(auVar229,local_630,8);
      auVar98 = vandps_avx512vl(auVar96,auVar97);
      auVar96 = vblendps_avx(auVar25,_local_610,8);
      auVar96 = vandps_avx512vl(auVar96,auVar97);
      auVar96 = vmaxps_avx(auVar98,auVar96);
      auVar96 = vmaxps_avx(auVar95,auVar96);
      auVar95 = vmovshdup_avx(auVar96);
      auVar95 = vmaxss_avx(auVar95,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar95);
      local_6a0 = vcvtsi2ss_avx512f(_local_610,iVar9);
      auVar111._0_4_ = local_6a0._0_4_;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar111._16_4_ = auVar111._0_4_;
      auVar111._20_4_ = auVar111._0_4_;
      auVar111._24_4_ = auVar111._0_4_;
      auVar111._28_4_ = auVar111._0_4_;
      uVar29 = vcmpps_avx512vl(auVar111,_DAT_02020f40,0xe);
      bVar88 = (byte)uVar151 & (byte)uVar29;
      auVar96 = vmulss_avx512f(auVar96,ZEXT416(0x35000000));
      auVar107._8_4_ = 2;
      auVar107._0_8_ = 0x200000002;
      auVar107._12_4_ = 2;
      auVar107._16_4_ = 2;
      auVar107._20_4_ = 2;
      auVar107._24_4_ = 2;
      auVar107._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar107,ZEXT1632(auVar23));
      local_120 = vpermps_avx512vl(auVar107,ZEXT1632(auVar24));
      local_140 = vpermps_avx512vl(auVar107,ZEXT1632(auVar229));
      auVar107 = vpermps_avx2(auVar107,ZEXT1632(auVar25));
      uVar85 = *(uint *)(ray + k * 4 + 0x30);
      auVar95 = local_120._0_16_;
      if (bVar88 == 0) {
        auVar95 = vxorps_avx512vl(auVar95,auVar95);
        auVar230 = ZEXT1664(auVar95);
        auVar228 = ZEXT3264(local_480);
        auVar227 = ZEXT3264(local_400);
        auVar231 = ZEXT3264(local_4a0);
        auVar232 = ZEXT3264(local_420);
        auVar233 = ZEXT3264(local_4c0);
        auVar234 = ZEXT3264(local_4e0);
      }
      else {
        local_520._0_16_ = ZEXT416(uVar85);
        auVar104 = vmulps_avx512vl(auVar107,auVar104);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_140,auVar104);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_120,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar102,local_100,auVar103);
        auVar114 = vmulps_avx512vl(auVar107,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_140,auVar114);
        auVar103 = vfmadd213ps_avx512vl(auVar119,local_120,auVar115);
        auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1f9c);
        auVar116 = vfmadd213ps_avx512vl(auVar117,local_100,auVar103);
        auVar117 = vmulps_avx512vl(local_440,auVar102);
        auVar103 = vmulps_avx512vl(local_460,auVar102);
        auVar221._0_4_ = auVar107._0_4_ * auVar102._0_4_;
        auVar221._4_4_ = auVar107._4_4_ * auVar102._4_4_;
        auVar221._8_4_ = auVar107._8_4_ * auVar102._8_4_;
        auVar221._12_4_ = auVar107._12_4_ * auVar102._12_4_;
        auVar221._16_4_ = auVar107._16_4_ * auVar102._16_4_;
        auVar221._20_4_ = auVar107._20_4_ * auVar102._20_4_;
        auVar221._24_4_ = auVar107._24_4_ * auVar102._24_4_;
        auVar221._28_4_ = 0;
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,local_4c0);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar114,local_4e0);
        auVar114 = vfmadd231ps_avx512vl(auVar221,local_140,auVar114);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,local_4a0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_420);
        auVar103 = vfmadd231ps_avx512vl(auVar114,local_120,auVar115);
        auVar113 = vfmadd231ps_avx512vl(auVar117,auVar119,local_480);
        auVar227 = ZEXT3264(local_400);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar119,local_400);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_100,auVar119);
        auVar104 = vmulps_avx512vl(local_440,auVar114);
        auVar118 = vmulps_avx512vl(local_460,auVar114);
        auVar119._4_4_ = auVar107._4_4_ * auVar114._4_4_;
        auVar119._0_4_ = auVar107._0_4_ * auVar114._0_4_;
        auVar119._8_4_ = auVar107._8_4_ * auVar114._8_4_;
        auVar119._12_4_ = auVar107._12_4_ * auVar114._12_4_;
        auVar119._16_4_ = auVar107._16_4_ * auVar114._16_4_;
        auVar119._20_4_ = auVar107._20_4_ * auVar114._20_4_;
        auVar119._24_4_ = auVar107._24_4_ * auVar114._24_4_;
        auVar119._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd231ps_avx512vl(auVar104,auVar115,local_4c0);
        auVar104 = vfmadd231ps_avx512vl(auVar118,auVar115,local_4e0);
        auVar115 = vfmadd231ps_avx512vl(auVar119,local_140,auVar115);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_4a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar119,local_420);
        auVar119 = vfmadd231ps_avx512vl(auVar115,local_120,auVar119);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar117,local_480);
        auVar114 = vfmadd231ps_avx512vl(auVar104,auVar117,local_400);
        auVar104 = vfmadd231ps_avx512vl(auVar119,local_100,auVar117);
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        auVar117 = vandps_avx(auVar113,auVar224);
        auVar119 = vandps_avx(auVar102,auVar224);
        auVar119 = vmaxps_avx(auVar117,auVar119);
        auVar117 = vandps_avx(auVar103,auVar224);
        auVar117 = vmaxps_avx(auVar119,auVar117);
        auVar103 = vbroadcastss_avx512vl(auVar96);
        auVar237 = ZEXT1664(auVar96);
        uVar81 = vcmpps_avx512vl(auVar117,auVar103,1);
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar118._0_4_ = (float)((uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar113._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar113._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar113._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar113._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar113._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar113._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar113._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar118._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar113._28_4_;
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar120._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar102._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar102._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar102._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar102._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar102._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar102._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar102._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar120._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar102._28_4_;
        auVar117 = vandps_avx(auVar224,auVar115);
        auVar119 = vandps_avx(auVar114,auVar224);
        auVar119 = vmaxps_avx(auVar117,auVar119);
        auVar117 = vandps_avx(auVar104,auVar224);
        auVar117 = vmaxps_avx(auVar119,auVar117);
        uVar81 = vcmpps_avx512vl(auVar117,auVar103,1);
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar121._0_4_ = (float)((uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar121._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar122._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar114._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar114._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar114._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar114._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar114._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar114._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar114._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar122._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar114._28_4_;
        auVar99 = vxorps_avx512vl(auVar95,auVar95);
        auVar230 = ZEXT1664(auVar99);
        auVar117 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar99));
        auVar95 = vfmadd231ps_fma(auVar117,auVar120,auVar120);
        auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar189 = auVar119._0_4_;
        fVar196 = auVar119._4_4_;
        fVar197 = auVar119._8_4_;
        fVar198 = auVar119._12_4_;
        fVar180 = auVar119._16_4_;
        fVar188 = auVar119._20_4_;
        fVar90 = auVar119._24_4_;
        auVar117._4_4_ = fVar196 * fVar196 * fVar196 * auVar95._4_4_ * -0.5;
        auVar117._0_4_ = fVar189 * fVar189 * fVar189 * auVar95._0_4_ * -0.5;
        auVar117._8_4_ = fVar197 * fVar197 * fVar197 * auVar95._8_4_ * -0.5;
        auVar117._12_4_ = fVar198 * fVar198 * fVar198 * auVar95._12_4_ * -0.5;
        auVar117._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar117._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar117._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar117._28_4_ = auVar104._28_4_;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar102,auVar119);
        auVar115._4_4_ = auVar120._4_4_ * auVar117._4_4_;
        auVar115._0_4_ = auVar120._0_4_ * auVar117._0_4_;
        auVar115._8_4_ = auVar120._8_4_ * auVar117._8_4_;
        auVar115._12_4_ = auVar120._12_4_ * auVar117._12_4_;
        auVar115._16_4_ = auVar120._16_4_ * auVar117._16_4_;
        auVar115._20_4_ = auVar120._20_4_ * auVar117._20_4_;
        auVar115._24_4_ = auVar120._24_4_ * auVar117._24_4_;
        auVar115._28_4_ = 0;
        auVar114._4_4_ = auVar117._4_4_ * -auVar118._4_4_;
        auVar114._0_4_ = auVar117._0_4_ * -auVar118._0_4_;
        auVar114._8_4_ = auVar117._8_4_ * -auVar118._8_4_;
        auVar114._12_4_ = auVar117._12_4_ * -auVar118._12_4_;
        auVar114._16_4_ = auVar117._16_4_ * -auVar118._16_4_;
        auVar114._20_4_ = auVar117._20_4_ * -auVar118._20_4_;
        auVar114._24_4_ = auVar117._24_4_ * -auVar118._24_4_;
        auVar114._28_4_ = auVar120._28_4_;
        auVar117 = vmulps_avx512vl(auVar117,ZEXT1632(auVar99));
        auVar108 = ZEXT1632(auVar99);
        auVar119 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar108);
        auVar95 = vfmadd231ps_fma(auVar119,auVar122,auVar122);
        auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar189 = auVar119._0_4_;
        fVar196 = auVar119._4_4_;
        fVar197 = auVar119._8_4_;
        fVar198 = auVar119._12_4_;
        fVar180 = auVar119._16_4_;
        fVar188 = auVar119._20_4_;
        fVar90 = auVar119._24_4_;
        auVar103._4_4_ = fVar196 * fVar196 * fVar196 * auVar95._4_4_ * -0.5;
        auVar103._0_4_ = fVar189 * fVar189 * fVar189 * auVar95._0_4_ * -0.5;
        auVar103._8_4_ = fVar197 * fVar197 * fVar197 * auVar95._8_4_ * -0.5;
        auVar103._12_4_ = fVar198 * fVar198 * fVar198 * auVar95._12_4_ * -0.5;
        auVar103._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar103._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar103._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar103._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar119);
        auVar113._4_4_ = auVar122._4_4_ * auVar102._4_4_;
        auVar113._0_4_ = auVar122._0_4_ * auVar102._0_4_;
        auVar113._8_4_ = auVar122._8_4_ * auVar102._8_4_;
        auVar113._12_4_ = auVar122._12_4_ * auVar102._12_4_;
        auVar113._16_4_ = auVar122._16_4_ * auVar102._16_4_;
        auVar113._20_4_ = auVar122._20_4_ * auVar102._20_4_;
        auVar113._24_4_ = auVar122._24_4_ * auVar102._24_4_;
        auVar113._28_4_ = auVar119._28_4_;
        auVar104._4_4_ = -auVar121._4_4_ * auVar102._4_4_;
        auVar104._0_4_ = -auVar121._0_4_ * auVar102._0_4_;
        auVar104._8_4_ = -auVar121._8_4_ * auVar102._8_4_;
        auVar104._12_4_ = -auVar121._12_4_ * auVar102._12_4_;
        auVar104._16_4_ = -auVar121._16_4_ * auVar102._16_4_;
        auVar104._20_4_ = -auVar121._20_4_ * auVar102._20_4_;
        auVar104._24_4_ = -auVar121._24_4_ * auVar102._24_4_;
        auVar104._28_4_ = auVar121._28_4_ ^ 0x80000000;
        auVar119 = vmulps_avx512vl(auVar102,auVar108);
        auVar95 = vfmadd213ps_fma(auVar115,auVar110,auVar105);
        auVar229 = vfmadd213ps_fma(auVar114,auVar110,auVar106);
        auVar102 = vfmadd213ps_avx512vl(auVar117,auVar110,auVar116);
        auVar103 = vfmadd213ps_avx512vl(auVar113,ZEXT1632(auVar28),ZEXT1632(auVar26));
        auVar97 = vfnmadd213ps_fma(auVar115,auVar110,auVar105);
        auVar105 = ZEXT1632(auVar28);
        auVar23 = vfmadd213ps_fma(auVar104,auVar105,ZEXT1632(auVar27));
        auVar98 = vfnmadd213ps_fma(auVar114,auVar110,auVar106);
        auVar24 = vfmadd213ps_fma(auVar119,auVar105,auVar112);
        auVar115 = vfnmadd231ps_avx512vl(auVar116,auVar110,auVar117);
        auVar32 = vfnmadd213ps_fma(auVar113,auVar105,ZEXT1632(auVar26));
        auVar27 = vfnmadd213ps_fma(auVar104,auVar105,ZEXT1632(auVar27));
        auVar33 = vfnmadd231ps_fma(auVar112,ZEXT1632(auVar28),auVar119);
        auVar119 = vsubps_avx512vl(auVar103,ZEXT1632(auVar97));
        auVar117 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar98));
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar24),auVar115);
        auVar113 = vmulps_avx512vl(auVar117,auVar115);
        auVar25 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar98),auVar114);
        auVar105._4_4_ = auVar97._4_4_ * auVar114._4_4_;
        auVar105._0_4_ = auVar97._0_4_ * auVar114._0_4_;
        auVar105._8_4_ = auVar97._8_4_ * auVar114._8_4_;
        auVar105._12_4_ = auVar97._12_4_ * auVar114._12_4_;
        auVar105._16_4_ = auVar114._16_4_ * 0.0;
        auVar105._20_4_ = auVar114._20_4_ * 0.0;
        auVar105._24_4_ = auVar114._24_4_ * 0.0;
        auVar105._28_4_ = auVar114._28_4_;
        auVar114 = vfmsub231ps_avx512vl(auVar105,auVar115,auVar119);
        auVar106._4_4_ = auVar98._4_4_ * auVar119._4_4_;
        auVar106._0_4_ = auVar98._0_4_ * auVar119._0_4_;
        auVar106._8_4_ = auVar98._8_4_ * auVar119._8_4_;
        auVar106._12_4_ = auVar98._12_4_ * auVar119._12_4_;
        auVar106._16_4_ = auVar119._16_4_ * 0.0;
        auVar106._20_4_ = auVar119._20_4_ * 0.0;
        auVar106._24_4_ = auVar119._24_4_ * 0.0;
        auVar106._28_4_ = auVar119._28_4_;
        auVar26 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar97),auVar117);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar26),auVar108,auVar114);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar108,ZEXT1632(auVar25));
        auVar118 = ZEXT1632(auVar99);
        uVar81 = vcmpps_avx512vl(auVar117,auVar118,2);
        bVar80 = (byte)uVar81;
        fVar90 = (float)((uint)(bVar80 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar32._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar141 = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar32._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar143 = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar32._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar146 = (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar32._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar90))));
        fVar91 = (float)((uint)(bVar80 & 1) * auVar229._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar27._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar142 = (float)((uint)bVar16 * auVar229._4_4_ | (uint)!bVar16 * auVar27._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar144 = (float)((uint)bVar16 * auVar229._8_4_ | (uint)!bVar16 * auVar27._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar147 = (float)((uint)bVar16 * auVar229._12_4_ | (uint)!bVar16 * auVar27._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar144,CONCAT44(fVar142,fVar91))));
        auVar116._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar33._0_4_
                    );
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar33._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar33._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar33._12_4_);
        fVar196 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar102._16_4_);
        auVar116._16_4_ = fVar196;
        fVar189 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar102._20_4_);
        auVar116._20_4_ = fVar189;
        fVar197 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar102._24_4_);
        auVar116._24_4_ = fVar197;
        iVar1 = (uint)(byte)(uVar81 >> 7) * auVar102._28_4_;
        auVar116._28_4_ = iVar1;
        auVar119 = vblendmps_avx512vl(ZEXT1632(auVar97),auVar103);
        auVar123._0_4_ =
             (uint)(bVar80 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar25._0_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar25._4_4_;
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar25._8_4_;
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar25._12_4_;
        auVar123._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_;
        auVar123._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_;
        auVar123._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_;
        auVar123._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar119._28_4_;
        auVar119 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar23));
        auVar124._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar119._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar229._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar229._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar229._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar229._12_4_);
        fVar198 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_);
        auVar124._16_4_ = fVar198;
        fVar180 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_);
        auVar124._20_4_ = fVar180;
        fVar188 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_);
        auVar124._24_4_ = fVar188;
        auVar124._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar119._28_4_;
        auVar119 = vblendmps_avx512vl(auVar115,ZEXT1632(auVar24));
        auVar125._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar119._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar102._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar16 * auVar119._4_4_ | (uint)!bVar16 * auVar102._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar16 * auVar119._8_4_ | (uint)!bVar16 * auVar102._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar16 * auVar119._12_4_ | (uint)!bVar16 * auVar102._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar16 * auVar119._16_4_ | (uint)!bVar16 * auVar102._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar16 * auVar119._20_4_ | (uint)!bVar16 * auVar102._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar16 * auVar119._24_4_ | (uint)!bVar16 * auVar102._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar125._28_4_ = (uint)bVar16 * auVar119._28_4_ | (uint)!bVar16 * auVar102._28_4_;
        auVar126._0_4_ =
             (uint)(bVar80 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar103._0_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar16 * (int)auVar97._4_4_ | (uint)!bVar16 * auVar103._4_4_;
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar16 * (int)auVar97._8_4_ | (uint)!bVar16 * auVar103._8_4_;
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar16 * (int)auVar97._12_4_ | (uint)!bVar16 * auVar103._12_4_;
        auVar126._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar103._16_4_;
        auVar126._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar103._20_4_;
        auVar126._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar103._24_4_;
        auVar126._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar103._28_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar127._0_4_ =
             (uint)(bVar80 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar24._0_4_;
        bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar17 * auVar115._4_4_ | (uint)!bVar17 * auVar24._4_4_;
        bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar17 * auVar115._8_4_ | (uint)!bVar17 * auVar24._8_4_;
        bVar17 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar17 * auVar115._12_4_ | (uint)!bVar17 * auVar24._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_;
        iVar2 = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
        auVar127._28_4_ = iVar2;
        auVar105 = vsubps_avx512vl(auVar126,auVar113);
        auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar98._12_4_ |
                                                 (uint)!bVar19 * auVar23._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar98._8_4_ |
                                                          (uint)!bVar18 * auVar23._8_4_,
                                                          CONCAT44((uint)bVar16 * (int)auVar98._4_4_
                                                                   | (uint)!bVar16 * auVar23._4_4_,
                                                                   (uint)(bVar80 & 1) *
                                                                   (int)auVar98._0_4_ |
                                                                   (uint)!(bool)(bVar80 & 1) *
                                                                   auVar23._0_4_)))),auVar104);
        auVar115 = vsubps_avx(auVar127,auVar116);
        auVar114 = vsubps_avx(auVar113,auVar123);
        auVar102 = vsubps_avx(auVar104,auVar124);
        auVar103 = vsubps_avx(auVar116,auVar125);
        auVar108._4_4_ = auVar115._4_4_ * fVar141;
        auVar108._0_4_ = auVar115._0_4_ * fVar90;
        auVar108._8_4_ = auVar115._8_4_ * fVar143;
        auVar108._12_4_ = auVar115._12_4_ * fVar146;
        auVar108._16_4_ = auVar115._16_4_ * 0.0;
        auVar108._20_4_ = auVar115._20_4_ * 0.0;
        auVar108._24_4_ = auVar115._24_4_ * 0.0;
        auVar108._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar108,auVar116,auVar105);
        auVar109._4_4_ = fVar142 * auVar105._4_4_;
        auVar109._0_4_ = fVar91 * auVar105._0_4_;
        auVar109._8_4_ = fVar144 * auVar105._8_4_;
        auVar109._12_4_ = fVar147 * auVar105._12_4_;
        auVar109._16_4_ = auVar105._16_4_ * 0.0;
        auVar109._20_4_ = auVar105._20_4_ * 0.0;
        auVar109._24_4_ = auVar105._24_4_ * 0.0;
        auVar109._28_4_ = auVar117._28_4_;
        auVar229 = vfmsub231ps_fma(auVar109,auVar113,auVar119);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar229),auVar118,ZEXT1632(auVar95));
        auVar192._0_4_ = auVar119._0_4_ * auVar116._0_4_;
        auVar192._4_4_ = auVar119._4_4_ * auVar116._4_4_;
        auVar192._8_4_ = auVar119._8_4_ * auVar116._8_4_;
        auVar192._12_4_ = auVar119._12_4_ * auVar116._12_4_;
        auVar192._16_4_ = auVar119._16_4_ * fVar196;
        auVar192._20_4_ = auVar119._20_4_ * fVar189;
        auVar192._24_4_ = auVar119._24_4_ * fVar197;
        auVar192._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar192,auVar104,auVar115);
        auVar106 = vfmadd231ps_avx512vl(auVar117,auVar118,ZEXT1632(auVar95));
        auVar117 = vmulps_avx512vl(auVar103,auVar123);
        auVar117 = vfmsub231ps_avx512vl(auVar117,auVar114,auVar125);
        auVar112._4_4_ = auVar102._4_4_ * auVar125._4_4_;
        auVar112._0_4_ = auVar102._0_4_ * auVar125._0_4_;
        auVar112._8_4_ = auVar102._8_4_ * auVar125._8_4_;
        auVar112._12_4_ = auVar102._12_4_ * auVar125._12_4_;
        auVar112._16_4_ = auVar102._16_4_ * auVar125._16_4_;
        auVar112._20_4_ = auVar102._20_4_ * auVar125._20_4_;
        auVar112._24_4_ = auVar102._24_4_ * auVar125._24_4_;
        auVar112._28_4_ = auVar125._28_4_;
        auVar95 = vfmsub231ps_fma(auVar112,auVar124,auVar103);
        auVar193._0_4_ = auVar124._0_4_ * auVar114._0_4_;
        auVar193._4_4_ = auVar124._4_4_ * auVar114._4_4_;
        auVar193._8_4_ = auVar124._8_4_ * auVar114._8_4_;
        auVar193._12_4_ = auVar124._12_4_ * auVar114._12_4_;
        auVar193._16_4_ = fVar198 * auVar114._16_4_;
        auVar193._20_4_ = fVar180 * auVar114._20_4_;
        auVar193._24_4_ = fVar188 * auVar114._24_4_;
        auVar193._28_4_ = 0;
        auVar229 = vfmsub231ps_fma(auVar193,auVar102,auVar123);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar229),auVar118,auVar117);
        auVar108 = vfmadd231ps_avx512vl(auVar117,auVar118,ZEXT1632(auVar95));
        auVar117 = vmaxps_avx(auVar106,auVar108);
        uVar151 = vcmpps_avx512vl(auVar117,auVar118,2);
        bVar88 = bVar88 & (byte)uVar151;
        auVar228 = ZEXT3264(local_480);
        auVar231 = ZEXT3264(local_4a0);
        auVar232 = ZEXT3264(local_420);
        auVar233 = ZEXT3264(local_4c0);
        auVar234 = ZEXT3264(local_4e0);
        auVar235 = ZEXT3264(local_440);
        if (bVar88 == 0) {
          bVar88 = 0;
        }
        else {
          auVar45._4_4_ = auVar103._4_4_ * auVar119._4_4_;
          auVar45._0_4_ = auVar103._0_4_ * auVar119._0_4_;
          auVar45._8_4_ = auVar103._8_4_ * auVar119._8_4_;
          auVar45._12_4_ = auVar103._12_4_ * auVar119._12_4_;
          auVar45._16_4_ = auVar103._16_4_ * auVar119._16_4_;
          auVar45._20_4_ = auVar103._20_4_ * auVar119._20_4_;
          auVar45._24_4_ = auVar103._24_4_ * auVar119._24_4_;
          auVar45._28_4_ = auVar117._28_4_;
          auVar23 = vfmsub231ps_fma(auVar45,auVar102,auVar115);
          auVar46._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar46._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar46._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar46._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar46._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar46._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar46._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar46._28_4_ = auVar115._28_4_;
          auVar229 = vfmsub231ps_fma(auVar46,auVar105,auVar103);
          auVar47._4_4_ = auVar102._4_4_ * auVar105._4_4_;
          auVar47._0_4_ = auVar102._0_4_ * auVar105._0_4_;
          auVar47._8_4_ = auVar102._8_4_ * auVar105._8_4_;
          auVar47._12_4_ = auVar102._12_4_ * auVar105._12_4_;
          auVar47._16_4_ = auVar102._16_4_ * auVar105._16_4_;
          auVar47._20_4_ = auVar102._20_4_ * auVar105._20_4_;
          auVar47._24_4_ = auVar102._24_4_ * auVar105._24_4_;
          auVar47._28_4_ = auVar102._28_4_;
          auVar24 = vfmsub231ps_fma(auVar47,auVar114,auVar119);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar229),ZEXT1632(auVar24));
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar23),auVar118);
          auVar119 = vrcp14ps_avx512vl(auVar117);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = &DAT_3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar115 = vfnmadd213ps_avx512vl(auVar119,auVar117,auVar36);
          auVar95 = vfmadd132ps_fma(auVar115,auVar119,auVar119);
          auVar48._4_4_ = auVar24._4_4_ * auVar116._4_4_;
          auVar48._0_4_ = auVar24._0_4_ * auVar116._0_4_;
          auVar48._8_4_ = auVar24._8_4_ * auVar116._8_4_;
          auVar48._12_4_ = auVar24._12_4_ * auVar116._12_4_;
          auVar48._16_4_ = fVar196 * 0.0;
          auVar48._20_4_ = fVar189 * 0.0;
          auVar48._24_4_ = fVar197 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar229 = vfmadd231ps_fma(auVar48,auVar104,ZEXT1632(auVar229));
          auVar229 = vfmadd231ps_fma(ZEXT1632(auVar229),auVar113,ZEXT1632(auVar23));
          fVar189 = auVar95._0_4_;
          fVar196 = auVar95._4_4_;
          fVar197 = auVar95._8_4_;
          fVar198 = auVar95._12_4_;
          auVar119 = ZEXT1632(CONCAT412(auVar229._12_4_ * fVar198,
                                        CONCAT48(auVar229._8_4_ * fVar197,
                                                 CONCAT44(auVar229._4_4_ * fVar196,
                                                          auVar229._0_4_ * fVar189))));
          auVar212._4_4_ = uVar85;
          auVar212._0_4_ = uVar85;
          auVar212._8_4_ = uVar85;
          auVar212._12_4_ = uVar85;
          auVar212._16_4_ = uVar85;
          auVar212._20_4_ = uVar85;
          auVar212._24_4_ = uVar85;
          auVar212._28_4_ = uVar85;
          uVar151 = vcmpps_avx512vl(auVar212,auVar119,2);
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar37._4_4_ = uVar150;
          auVar37._0_4_ = uVar150;
          auVar37._8_4_ = uVar150;
          auVar37._12_4_ = uVar150;
          auVar37._16_4_ = uVar150;
          auVar37._20_4_ = uVar150;
          auVar37._24_4_ = uVar150;
          auVar37._28_4_ = uVar150;
          uVar29 = vcmpps_avx512vl(auVar119,auVar37,2);
          bVar88 = (byte)uVar151 & (byte)uVar29 & bVar88;
          if (bVar88 != 0) {
            uVar151 = vcmpps_avx512vl(auVar117,auVar118,4);
            if ((bVar88 & (byte)uVar151) != 0) {
              bVar88 = bVar88 & (byte)uVar151;
              fVar180 = auVar106._0_4_ * fVar189;
              fVar188 = auVar106._4_4_ * fVar196;
              auVar49._4_4_ = fVar188;
              auVar49._0_4_ = fVar180;
              fVar90 = auVar106._8_4_ * fVar197;
              auVar49._8_4_ = fVar90;
              fVar91 = auVar106._12_4_ * fVar198;
              auVar49._12_4_ = fVar91;
              fVar141 = auVar106._16_4_ * 0.0;
              auVar49._16_4_ = fVar141;
              fVar142 = auVar106._20_4_ * 0.0;
              auVar49._20_4_ = fVar142;
              fVar143 = auVar106._24_4_ * 0.0;
              auVar49._24_4_ = fVar143;
              auVar49._28_4_ = auVar106._28_4_;
              fVar189 = auVar108._0_4_ * fVar189;
              fVar196 = auVar108._4_4_ * fVar196;
              auVar50._4_4_ = fVar196;
              auVar50._0_4_ = fVar189;
              fVar197 = auVar108._8_4_ * fVar197;
              auVar50._8_4_ = fVar197;
              fVar198 = auVar108._12_4_ * fVar198;
              auVar50._12_4_ = fVar198;
              fVar144 = auVar108._16_4_ * 0.0;
              auVar50._16_4_ = fVar144;
              fVar146 = auVar108._20_4_ * 0.0;
              auVar50._20_4_ = fVar146;
              fVar147 = auVar108._24_4_ * 0.0;
              auVar50._24_4_ = fVar147;
              auVar50._28_4_ = auVar108._28_4_;
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = &DAT_3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar117 = vsubps_avx(auVar206,auVar49);
              local_5a0._0_4_ =
                   (uint)(bVar80 & 1) * (int)fVar180 | (uint)!(bool)(bVar80 & 1) * auVar117._0_4_;
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar16 * (int)fVar188 | (uint)!bVar16 * auVar117._4_4_;
              bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar16 * (int)fVar90 | (uint)!bVar16 * auVar117._8_4_;
              bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar16 * (int)fVar91 | (uint)!bVar16 * auVar117._12_4_;
              bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar16 * (int)fVar141 | (uint)!bVar16 * auVar117._16_4_;
              bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar16 * (int)fVar142 | (uint)!bVar16 * auVar117._20_4_;
              bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar16 * (int)fVar143 | (uint)!bVar16 * auVar117._24_4_;
              bVar16 = SUB81(uVar81 >> 7,0);
              local_5a0._28_4_ = (uint)bVar16 * auVar106._28_4_ | (uint)!bVar16 * auVar117._28_4_;
              auVar117 = vsubps_avx(auVar206,auVar50);
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar81 >> 6) & 1);
              bVar22 = SUB81(uVar81 >> 7,0);
              local_1a0._4_4_ = (uint)bVar16 * (int)fVar196 | (uint)!bVar16 * auVar117._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar80 & 1) * (int)fVar189 | (uint)!(bool)(bVar80 & 1) * auVar117._0_4_;
              local_1a0._8_4_ = (uint)bVar17 * (int)fVar197 | (uint)!bVar17 * auVar117._8_4_;
              local_1a0._12_4_ = (uint)bVar18 * (int)fVar198 | (uint)!bVar18 * auVar117._12_4_;
              local_1a0._16_4_ = (uint)bVar19 * (int)fVar144 | (uint)!bVar19 * auVar117._16_4_;
              local_1a0._20_4_ = (uint)bVar20 * (int)fVar146 | (uint)!bVar20 * auVar117._20_4_;
              local_1a0._24_4_ = (uint)bVar21 * (int)fVar147 | (uint)!bVar21 * auVar117._24_4_;
              local_1a0._28_4_ = (uint)bVar22 * auVar108._28_4_ | (uint)!bVar22 * auVar117._28_4_;
              local_5c0 = auVar119;
              goto LAB_01c81c20;
            }
          }
          bVar88 = 0;
        }
LAB_01c81c20:
        auVar226 = ZEXT3264(auVar107);
        if (bVar88 != 0) {
          auVar117 = vsubps_avx(ZEXT1632(auVar28),auVar110);
          auVar95 = vfmadd213ps_fma(auVar117,local_5a0,auVar110);
          uVar150 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
          auVar110._4_4_ = uVar150;
          auVar110._0_4_ = uVar150;
          auVar110._8_4_ = uVar150;
          auVar110._12_4_ = uVar150;
          auVar110._16_4_ = uVar150;
          auVar110._20_4_ = uVar150;
          auVar110._24_4_ = uVar150;
          auVar110._28_4_ = uVar150;
          auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                        CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                 CONCAT44(auVar95._4_4_ +
                                                                          auVar95._4_4_,
                                                                          auVar95._0_4_ +
                                                                          auVar95._0_4_)))),auVar110
                                    );
          uVar151 = vcmpps_avx512vl(local_5c0,auVar117,6);
          bVar88 = bVar88 & (byte)uVar151;
          if (bVar88 != 0) {
            auVar160._8_4_ = 0xbf800000;
            auVar160._0_8_ = 0xbf800000bf800000;
            auVar160._12_4_ = 0xbf800000;
            auVar160._16_4_ = 0xbf800000;
            auVar160._20_4_ = 0xbf800000;
            auVar160._24_4_ = 0xbf800000;
            auVar160._28_4_ = 0xbf800000;
            auVar38._8_4_ = 0x40000000;
            auVar38._0_8_ = 0x4000000040000000;
            auVar38._12_4_ = 0x40000000;
            auVar38._16_4_ = 0x40000000;
            auVar38._20_4_ = 0x40000000;
            auVar38._24_4_ = 0x40000000;
            auVar38._28_4_ = 0x40000000;
            local_380 = vfmadd132ps_avx512vl(local_1a0,auVar160,auVar38);
            local_1a0 = local_380;
            auVar117 = local_1a0;
            local_340 = 0;
            local_330 = local_690._0_8_;
            uStack_328 = local_690._8_8_;
            local_320 = local_620._0_8_;
            uStack_318 = local_620._8_8_;
            local_310 = local_630._0_8_;
            uStack_308 = local_630._8_8_;
            local_300 = local_610;
            uStack_2f8 = uStack_608;
            local_1a0 = auVar117;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar189 = 1.0 / auVar111._0_4_;
              local_2e0[0] = fVar189 * (local_5a0._0_4_ + 0.0);
              local_2e0[1] = fVar189 * (local_5a0._4_4_ + 1.0);
              local_2e0[2] = fVar189 * (local_5a0._8_4_ + 2.0);
              local_2e0[3] = fVar189 * (local_5a0._12_4_ + 3.0);
              fStack_2d0 = fVar189 * (local_5a0._16_4_ + 4.0);
              fStack_2cc = fVar189 * (local_5a0._20_4_ + 5.0);
              fStack_2c8 = fVar189 * (local_5a0._24_4_ + 6.0);
              fStack_2c4 = local_5a0._28_4_ + 7.0;
              local_1a0._0_8_ = local_380._0_8_;
              local_1a0._8_8_ = local_380._8_8_;
              local_1a0._16_8_ = local_380._16_8_;
              local_1a0._24_8_ = local_380._24_8_;
              local_2c0 = local_1a0._0_8_;
              uStack_2b8 = local_1a0._8_8_;
              uStack_2b0 = local_1a0._16_8_;
              uStack_2a8 = local_1a0._24_8_;
              local_2a0 = local_5c0;
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar117 = vblendmps_avx512vl(auVar161,local_5c0);
              auVar128._0_4_ =
                   (uint)(bVar88 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar88 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar88 >> 6 & 1);
              auVar128._24_4_ = (uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar128._28_4_ =
                   (uint)(bVar88 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
              auVar117 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar117 = vminps_avx(auVar128,auVar117);
              auVar119 = vshufpd_avx(auVar117,auVar117,5);
              auVar117 = vminps_avx(auVar117,auVar119);
              auVar119 = vpermpd_avx2(auVar117,0x4e);
              auVar117 = vminps_avx(auVar117,auVar119);
              uVar151 = vcmpps_avx512vl(auVar128,auVar117,0);
              bVar79 = (byte)uVar151 & bVar88;
              bVar80 = bVar88;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              uVar83 = 0;
              for (uVar82 = (uint)bVar80; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                uVar83 = uVar83 + 1;
              }
              uVar81 = (ulong)uVar83;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar189 = local_2e0[uVar81];
                uVar150 = *(undefined4 *)((long)&local_2c0 + uVar81 * 4);
                fVar197 = 1.0 - fVar189;
                fVar196 = fVar197 * fVar197 * -3.0;
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),
                                          ZEXT416((uint)(fVar189 * fVar197)),ZEXT416(0xc0000000));
                auVar229 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar197)),
                                           ZEXT416((uint)(fVar189 * fVar189)),ZEXT416(0x40000000));
                fVar197 = auVar95._0_4_ * 3.0;
                fVar198 = auVar229._0_4_ * 3.0;
                fVar180 = fVar189 * fVar189 * 3.0;
                auVar202._0_4_ = fVar180 * (float)local_610._0_4_;
                auVar202._4_4_ = fVar180 * (float)local_610._4_4_;
                auVar202._8_4_ = fVar180 * (float)uStack_608;
                auVar202._12_4_ = fVar180 * uStack_608._4_4_;
                auVar176._4_4_ = fVar198;
                auVar176._0_4_ = fVar198;
                auVar176._8_4_ = fVar198;
                auVar176._12_4_ = fVar198;
                auVar95 = vfmadd132ps_fma(auVar176,auVar202,local_630);
                auVar183._4_4_ = fVar197;
                auVar183._0_4_ = fVar197;
                auVar183._8_4_ = fVar197;
                auVar183._12_4_ = fVar197;
                auVar95 = vfmadd132ps_fma(auVar183,auVar95,local_620);
                auVar177._4_4_ = fVar196;
                auVar177._0_4_ = fVar196;
                auVar177._8_4_ = fVar196;
                auVar177._12_4_ = fVar196;
                auVar95 = vfmadd132ps_fma(auVar177,auVar95,local_690);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar81 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar95._0_4_;
                uVar10 = vextractps_avx(auVar95,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                uVar10 = vextractps_avx(auVar95,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                *(float *)(ray + k * 4 + 0xf0) = fVar189;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                *(uint *)(ray + k * 4 + 0x110) = uVar8;
                *(uint *)(ray + k * 4 + 0x120) = uVar7;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_540 = vpbroadcastd_avx512vl();
                local_550 = vpbroadcastd_avx512vl();
                local_640 = local_620._0_4_;
                uStack_63c = local_620._4_4_;
                uStack_638 = local_620._8_8_;
                local_560 = local_630._0_4_;
                uStack_55c = local_630._4_4_;
                uStack_558 = local_630._8_8_;
                local_650 = auVar96;
                local_570 = (float)local_610._0_4_;
                fStack_56c = (float)local_610._4_4_;
                fStack_568 = (float)uStack_608;
                fStack_564 = uStack_608._4_4_;
                local_500 = auVar107;
                local_3a0 = local_5a0;
                local_360 = local_5c0;
                local_33c = iVar9;
                local_2f0 = bVar88;
                do {
                  auVar229 = auVar230._0_16_;
                  local_1e0 = (float)*(undefined4 *)(ray + k * 4 + 0x80);
                  local_240 = local_2e0[uVar81];
                  local_230 = *(undefined4 *)((long)&local_2c0 + uVar81 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar81 * 4);
                  local_680.context = context->user;
                  fVar196 = 1.0 - local_240;
                  fVar189 = fVar196 * fVar196 * -3.0;
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                            ZEXT416((uint)(local_240 * fVar196)),ZEXT416(0xc0000000)
                                           );
                  auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar196)),
                                            ZEXT416((uint)(local_240 * local_240)),
                                            ZEXT416(0x40000000));
                  fVar196 = auVar96._0_4_ * 3.0;
                  fVar197 = auVar95._0_4_ * 3.0;
                  fVar198 = local_240 * local_240 * 3.0;
                  auVar205._0_4_ = fVar198 * local_570;
                  auVar205._4_4_ = fVar198 * fStack_56c;
                  auVar205._8_4_ = fVar198 * fStack_568;
                  auVar205._12_4_ = fVar198 * fStack_564;
                  auVar158._4_4_ = fVar197;
                  auVar158._0_4_ = fVar197;
                  auVar158._8_4_ = fVar197;
                  auVar158._12_4_ = fVar197;
                  auVar77._4_4_ = uStack_55c;
                  auVar77._0_4_ = local_560;
                  auVar77._8_8_ = uStack_558;
                  auVar96 = vfmadd132ps_fma(auVar158,auVar205,auVar77);
                  auVar186._4_4_ = fVar196;
                  auVar186._0_4_ = fVar196;
                  auVar186._8_4_ = fVar196;
                  auVar186._12_4_ = fVar196;
                  auVar75._4_4_ = uStack_63c;
                  auVar75._0_4_ = local_640;
                  auVar75._8_8_ = uStack_638;
                  auVar96 = vfmadd132ps_fma(auVar186,auVar96,auVar75);
                  auVar159._4_4_ = fVar189;
                  auVar159._0_4_ = fVar189;
                  auVar159._8_4_ = fVar189;
                  auVar159._12_4_ = fVar189;
                  auVar96 = vfmadd132ps_fma(auVar159,auVar96,local_690);
                  local_270 = auVar96._0_4_;
                  local_260 = vshufps_avx(auVar96,auVar96,0x55);
                  local_250 = vshufps_avx(auVar96,auVar96,0xaa);
                  iStack_26c = local_270;
                  iStack_268 = local_270;
                  iStack_264 = local_270;
                  fStack_23c = local_240;
                  fStack_238 = local_240;
                  fStack_234 = local_240;
                  uStack_22c = local_230;
                  uStack_228 = local_230;
                  uStack_224 = local_230;
                  local_220 = local_550._0_8_;
                  uStack_218 = local_550._8_8_;
                  local_210 = local_540;
                  vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                  uStack_1fc = (local_680.context)->instID[0];
                  local_200 = uStack_1fc;
                  uStack_1f8 = uStack_1fc;
                  uStack_1f4 = uStack_1fc;
                  uStack_1f0 = (local_680.context)->instPrimID[0];
                  uStack_1ec = uStack_1f0;
                  uStack_1e8 = uStack_1f0;
                  uStack_1e4 = uStack_1f0;
                  local_6c0 = local_3d0._0_8_;
                  uStack_6b8 = local_3d0._8_8_;
                  local_680.valid = (int *)&local_6c0;
                  local_680.geometryUserPtr = pGVar11->userPtr;
                  local_680.hit = (RTCHitN *)&local_270;
                  local_680.N = 4;
                  local_3c0 = (uint)uVar81;
                  uStack_3bc = (uint)(uVar81 >> 0x20);
                  local_680.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->intersectionFilterN)(&local_680);
                    uVar81 = CONCAT44(uStack_3bc,local_3c0);
                    auVar237 = ZEXT1664(local_650);
                    auVar226 = ZEXT3264(local_500);
                    auVar236 = ZEXT3264(local_460);
                    auVar235 = ZEXT3264(local_440);
                    auVar234 = ZEXT3264(local_4e0);
                    auVar233 = ZEXT3264(local_4c0);
                    auVar232 = ZEXT3264(local_420);
                    auVar231 = ZEXT3264(local_4a0);
                    auVar227 = ZEXT3264(local_400);
                    auVar228 = ZEXT3264(local_480);
                    auVar96 = vxorps_avx512vl(auVar229,auVar229);
                    auVar230 = ZEXT1664(auVar96);
                    uVar85 = local_520._0_4_;
                  }
                  auVar96 = auVar230._0_16_;
                  auVar73._8_8_ = uStack_6b8;
                  auVar73._0_8_ = local_6c0;
                  uVar89 = vptestmd_avx512vl(auVar73,auVar73);
                  if ((uVar89 & 0xf) == 0) {
LAB_01c8327d:
                    *(float *)(ray + k * 4 + 0x80) = local_1e0;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_680);
                      uVar81 = CONCAT44(uStack_3bc,local_3c0);
                      auVar237 = ZEXT1664(local_650);
                      auVar226 = ZEXT3264(local_500);
                      auVar236 = ZEXT3264(local_460);
                      auVar235 = ZEXT3264(local_440);
                      auVar234 = ZEXT3264(local_4e0);
                      auVar233 = ZEXT3264(local_4c0);
                      auVar232 = ZEXT3264(local_420);
                      auVar231 = ZEXT3264(local_4a0);
                      auVar227 = ZEXT3264(local_400);
                      auVar228 = ZEXT3264(local_480);
                      auVar96 = vxorps_avx512vl(auVar96,auVar96);
                      auVar230 = ZEXT1664(auVar96);
                      uVar85 = local_520._0_4_;
                    }
                    auVar74._8_8_ = uStack_6b8;
                    auVar74._0_8_ = local_6c0;
                    uVar89 = vptestmd_avx512vl(auVar74,auVar74);
                    uVar89 = uVar89 & 0xf;
                    bVar80 = (byte)uVar89;
                    if (bVar80 == 0) goto LAB_01c8327d;
                    iVar1 = *(int *)(local_680.hit + 4);
                    iVar2 = *(int *)(local_680.hit + 8);
                    iVar70 = *(int *)(local_680.hit + 0xc);
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                    bVar18 = SUB81(uVar89 >> 3,0);
                    *(uint *)(local_680.ray + 0xc0) =
                         (uint)(bVar80 & 1) * *(int *)local_680.hit |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_680.ray + 0xc0);
                    *(uint *)(local_680.ray + 0xc4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xc4);
                    *(uint *)(local_680.ray + 200) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 200);
                    *(uint *)(local_680.ray + 0xcc) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xcc);
                    iVar1 = *(int *)(local_680.hit + 0x14);
                    iVar2 = *(int *)(local_680.hit + 0x18);
                    iVar70 = *(int *)(local_680.hit + 0x1c);
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                    bVar18 = SUB81(uVar89 >> 3,0);
                    *(uint *)(local_680.ray + 0xd0) =
                         (uint)(bVar80 & 1) * *(int *)(local_680.hit + 0x10) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_680.ray + 0xd0);
                    *(uint *)(local_680.ray + 0xd4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xd4);
                    *(uint *)(local_680.ray + 0xd8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xd8);
                    *(uint *)(local_680.ray + 0xdc) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xdc);
                    iVar1 = *(int *)(local_680.hit + 0x24);
                    iVar2 = *(int *)(local_680.hit + 0x28);
                    iVar70 = *(int *)(local_680.hit + 0x2c);
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                    bVar18 = SUB81(uVar89 >> 3,0);
                    *(uint *)(local_680.ray + 0xe0) =
                         (uint)(bVar80 & 1) * *(int *)(local_680.hit + 0x20) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_680.ray + 0xe0);
                    *(uint *)(local_680.ray + 0xe4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xe4);
                    *(uint *)(local_680.ray + 0xe8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xe8);
                    *(uint *)(local_680.ray + 0xec) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xec);
                    iVar1 = *(int *)(local_680.hit + 0x34);
                    iVar2 = *(int *)(local_680.hit + 0x38);
                    iVar70 = *(int *)(local_680.hit + 0x3c);
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                    bVar18 = SUB81(uVar89 >> 3,0);
                    *(uint *)(local_680.ray + 0xf0) =
                         (uint)(bVar80 & 1) * *(int *)(local_680.hit + 0x30) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_680.ray + 0xf0);
                    *(uint *)(local_680.ray + 0xf4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xf4);
                    *(uint *)(local_680.ray + 0xf8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xf8);
                    *(uint *)(local_680.ray + 0xfc) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xfc);
                    auVar96 = *(undefined1 (*) [16])(local_680.ray + 0x100);
                    auVar101._0_4_ =
                         (uint)(bVar80 & 1) * *(int *)(local_680.hit + 0x40) |
                         (uint)!(bool)(bVar80 & 1) * auVar96._0_4_;
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar101._4_4_ =
                         (uint)bVar16 * *(int *)(local_680.hit + 0x44) |
                         (uint)!bVar16 * auVar96._4_4_;
                    bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar101._8_4_ =
                         (uint)bVar16 * *(int *)(local_680.hit + 0x48) |
                         (uint)!bVar16 * auVar96._8_4_;
                    bVar16 = SUB81(uVar89 >> 3,0);
                    auVar101._12_4_ =
                         (uint)bVar16 * *(int *)(local_680.hit + 0x4c) |
                         (uint)!bVar16 * auVar96._12_4_;
                    *(undefined1 (*) [16])(local_680.ray + 0x100) = auVar101;
                    auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x50));
                    *(undefined1 (*) [16])(local_680.ray + 0x110) = auVar96;
                    auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x60));
                    *(undefined1 (*) [16])(local_680.ray + 0x120) = auVar96;
                    auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x70));
                    *(undefined1 (*) [16])(local_680.ray + 0x130) = auVar96;
                    auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x80));
                    *(undefined1 (*) [16])(local_680.ray + 0x140) = auVar96;
                  }
                  auVar107 = auVar226._0_32_;
                  auVar96 = auVar237._0_16_;
                  bVar80 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & bVar88;
                  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar44._4_4_ = uVar150;
                  auVar44._0_4_ = uVar150;
                  auVar44._8_4_ = uVar150;
                  auVar44._12_4_ = uVar150;
                  auVar44._16_4_ = uVar150;
                  auVar44._20_4_ = uVar150;
                  auVar44._24_4_ = uVar150;
                  auVar44._28_4_ = uVar150;
                  uVar151 = vcmpps_avx512vl(local_5c0,auVar44,2);
                  bVar88 = bVar80 & (byte)uVar151;
                  if ((bVar80 & (byte)uVar151) != 0) {
                    auVar165._8_4_ = 0x7f800000;
                    auVar165._0_8_ = 0x7f8000007f800000;
                    auVar165._12_4_ = 0x7f800000;
                    auVar165._16_4_ = 0x7f800000;
                    auVar165._20_4_ = 0x7f800000;
                    auVar165._24_4_ = 0x7f800000;
                    auVar165._28_4_ = 0x7f800000;
                    auVar117 = vblendmps_avx512vl(auVar165,local_5c0);
                    auVar140._0_4_ =
                         (uint)(bVar88 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 1 & 1);
                    auVar140._4_4_ = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 2 & 1);
                    auVar140._8_4_ = (uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 3 & 1);
                    auVar140._12_4_ = (uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 4 & 1);
                    auVar140._16_4_ = (uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 5 & 1);
                    auVar140._20_4_ = (uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar88 >> 6 & 1);
                    auVar140._24_4_ = (uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar140._28_4_ =
                         (uint)(bVar88 >> 7) * auVar117._28_4_ |
                         (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
                    auVar117 = vshufps_avx(auVar140,auVar140,0xb1);
                    auVar117 = vminps_avx(auVar140,auVar117);
                    auVar119 = vshufpd_avx(auVar117,auVar117,5);
                    auVar117 = vminps_avx(auVar117,auVar119);
                    auVar119 = vpermpd_avx2(auVar117,0x4e);
                    auVar117 = vminps_avx(auVar117,auVar119);
                    uVar151 = vcmpps_avx512vl(auVar140,auVar117,0);
                    bVar79 = (byte)uVar151 & bVar88;
                    bVar80 = bVar88;
                    if (bVar79 != 0) {
                      bVar80 = bVar79;
                    }
                    uVar83 = 0;
                    for (uVar82 = (uint)bVar80; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar81 = (ulong)uVar83;
                  }
                } while (bVar88 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        auVar117 = vpbroadcastd_avx512vl();
        auVar237 = ZEXT3264(auVar117);
        local_520 = vbroadcastss_avx512vl(auVar96);
        local_1e0 = 1.0 / (float)local_6a0._0_4_;
        fStack_1dc = local_1e0;
        fStack_1d8 = local_1e0;
        fStack_1d4 = local_1e0;
        fStack_1d0 = local_1e0;
        fStack_1cc = local_1e0;
        fStack_1c8 = local_1e0;
        fStack_1c4 = local_1e0;
        local_540 = vpbroadcastd_avx512vl();
        local_550 = vpbroadcastd_avx512vl();
        lVar84 = 8;
        local_500 = auVar107;
        local_3c0 = uVar85;
        uStack_3bc = uVar85;
        uStack_3b8 = uVar85;
        uStack_3b4 = uVar85;
        uStack_3b0 = uVar85;
        uStack_3ac = uVar85;
        uStack_3a8 = uVar85;
        uStack_3a4 = uVar85;
        do {
          auVar117 = vpbroadcastd_avx512vl();
          auVar102 = vpor_avx2(auVar117,_DAT_0205a920);
          uVar29 = vpcmpgtd_avx512vl(auVar237._0_32_,auVar102);
          auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 * 4 + lVar30);
          auVar119 = *(undefined1 (*) [32])(lVar30 + 0x2227768 + lVar84 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar30 + 0x2227bec + lVar84 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar30 + 0x2228070 + lVar84 * 4);
          local_440 = auVar235._0_32_;
          auVar103 = vmulps_avx512vl(local_440,auVar114);
          local_460 = auVar236._0_32_;
          auVar113 = vmulps_avx512vl(local_460,auVar114);
          auVar51._4_4_ = auVar114._4_4_ * (float)local_e0._4_4_;
          auVar51._0_4_ = auVar114._0_4_ * (float)local_e0._0_4_;
          auVar51._8_4_ = auVar114._8_4_ * fStack_d8;
          auVar51._12_4_ = auVar114._12_4_ * fStack_d4;
          auVar51._16_4_ = auVar114._16_4_ * fStack_d0;
          auVar51._20_4_ = auVar114._20_4_ * fStack_cc;
          auVar51._24_4_ = auVar114._24_4_ * fStack_c8;
          auVar51._28_4_ = auVar102._28_4_;
          auVar121 = auVar233._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar103,auVar115,auVar121);
          auVar122 = auVar234._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar122);
          auVar113 = vfmadd231ps_avx512vl(auVar51,auVar115,local_c0);
          auVar120 = auVar231._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar119,auVar120);
          local_420 = auVar232._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar119,local_420);
          auVar96 = vfmadd231ps_fma(auVar113,auVar119,local_a0);
          auVar118 = auVar228._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar118);
          local_400 = auVar227._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar103,auVar117,local_400);
          auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 * 4 + lVar30);
          auVar103 = *(undefined1 (*) [32])(lVar30 + 0x2229b88 + lVar84 * 4);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar117,local_80);
          auVar113 = *(undefined1 (*) [32])(lVar30 + 0x222a00c + lVar84 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar30 + 0x222a490 + lVar84 * 4);
          auVar107 = vmulps_avx512vl(local_440,auVar104);
          auVar105 = vmulps_avx512vl(local_460,auVar104);
          auVar52._4_4_ = auVar104._4_4_ * (float)local_e0._4_4_;
          auVar52._0_4_ = auVar104._0_4_ * (float)local_e0._0_4_;
          auVar52._8_4_ = auVar104._8_4_ * fStack_d8;
          auVar52._12_4_ = auVar104._12_4_ * fStack_d4;
          auVar52._16_4_ = auVar104._16_4_ * fStack_d0;
          auVar52._20_4_ = auVar104._20_4_ * fStack_cc;
          auVar52._24_4_ = auVar104._24_4_ * fStack_c8;
          auVar52._28_4_ = uStack_c4;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar121);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar122);
          auVar109 = vfmadd231ps_avx512vl(auVar52,auVar113,local_c0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar120);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_420);
          auVar95 = vfmadd231ps_fma(auVar109,auVar103,local_a0);
          auVar109 = vfmadd231ps_avx512vl(auVar107,auVar102,auVar118);
          auVar110 = vfmadd231ps_avx512vl(auVar105,auVar102,local_400);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar102,local_80);
          auVar111 = vmaxps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar95));
          auVar107 = vsubps_avx(auVar109,auVar106);
          auVar105 = vsubps_avx(auVar110,auVar108);
          auVar112 = vmulps_avx512vl(auVar108,auVar107);
          auVar116 = vmulps_avx512vl(auVar106,auVar105);
          auVar112 = vsubps_avx512vl(auVar112,auVar116);
          auVar116 = vmulps_avx512vl(auVar105,auVar105);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar107,auVar107);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          auVar111 = vmulps_avx512vl(auVar111,auVar116);
          auVar112 = vmulps_avx512vl(auVar112,auVar112);
          uVar151 = vcmpps_avx512vl(auVar112,auVar111,2);
          local_2f0 = (byte)uVar29 & (byte)uVar151;
          if (local_2f0 == 0) {
            auVar227 = ZEXT3264(local_400);
          }
          else {
            auVar104 = vmulps_avx512vl(local_500,auVar104);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_140,auVar104);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_120,auVar113);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_100,auVar103);
            auVar114 = vmulps_avx512vl(local_500,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_140,auVar114);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_120,auVar115);
            auVar103 = vfmadd213ps_avx512vl(auVar117,local_100,auVar119);
            auVar117 = *(undefined1 (*) [32])(lVar30 + 0x22284f4 + lVar84 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar30 + 0x2228978 + lVar84 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar30 + 0x2228dfc + lVar84 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar30 + 0x2229280 + lVar84 * 4);
            auVar113 = vmulps_avx512vl(local_440,auVar114);
            auVar104 = vmulps_avx512vl(local_460,auVar114);
            auVar114 = vmulps_avx512vl(local_500,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar121);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,auVar122);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_140,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar113,auVar119,auVar120);
            auVar113 = vfmadd231ps_avx512vl(auVar104,auVar119,local_420);
            auVar119 = vfmadd231ps_avx512vl(auVar115,local_120,auVar119);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar118);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar117,local_400);
            auVar104 = vfmadd231ps_avx512vl(auVar119,local_100,auVar117);
            auVar117 = *(undefined1 (*) [32])(lVar30 + 0x222a914 + lVar84 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar30 + 0x222b21c + lVar84 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar30 + 0x222b6a0 + lVar84 * 4);
            auVar111 = vmulps_avx512vl(local_440,auVar115);
            auVar112 = vmulps_avx512vl(local_460,auVar115);
            auVar115 = vmulps_avx512vl(local_500,auVar115);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,auVar121);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar119,auVar122);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_140,auVar119);
            auVar119 = *(undefined1 (*) [32])(lVar30 + 0x222ad98 + lVar84 * 4);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,auVar120);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar119,local_420);
            auVar119 = vfmadd231ps_avx512vl(auVar115,local_120,auVar119);
            auVar115 = vfmadd231ps_avx512vl(auVar111,auVar117,auVar118);
            auVar111 = vfmadd231ps_avx512vl(auVar112,auVar117,local_400);
            auVar119 = vfmadd231ps_avx512vl(auVar119,local_100,auVar117);
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar112);
            vandps_avx512vl(auVar113,auVar112);
            auVar117 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar104,auVar112);
            auVar117 = vmaxps_avx(auVar117,auVar112);
            uVar81 = vcmpps_avx512vl(auVar117,local_520,1);
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar129._0_4_ = (float)((uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar114._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar114._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar114._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar114._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar114._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar114._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar114._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar129._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar114._28_4_;
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar130._0_4_ = (float)((uint)bVar16 * auVar105._0_4_ | (uint)!bVar16 * auVar113._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar113._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar113._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar113._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar16 * auVar105._16_4_ | (uint)!bVar16 * auVar113._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar16 * auVar105._20_4_ | (uint)!bVar16 * auVar113._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar16 * auVar105._24_4_ | (uint)!bVar16 * auVar113._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar130._28_4_ = (uint)bVar16 * auVar105._28_4_ | (uint)!bVar16 * auVar113._28_4_;
            vandps_avx512vl(auVar115,auVar112);
            vandps_avx512vl(auVar111,auVar112);
            auVar117 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar119,auVar112);
            auVar117 = vmaxps_avx(auVar117,auVar130);
            uVar81 = vcmpps_avx512vl(auVar117,local_520,1);
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar131._0_4_ = (uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar115._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar115._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar115._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar115._12_4_;
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar115._16_4_;
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar115._20_4_;
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar115._24_4_;
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar131._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar115._28_4_;
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar132._0_4_ = (float)((uint)bVar16 * auVar105._0_4_ | (uint)!bVar16 * auVar111._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar111._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar111._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar111._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar16 * auVar105._16_4_ | (uint)!bVar16 * auVar111._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar16 * auVar105._20_4_ | (uint)!bVar16 * auVar111._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar16 * auVar105._24_4_ | (uint)!bVar16 * auVar111._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar132._28_4_ = (uint)bVar16 * auVar105._28_4_ | (uint)!bVar16 * auVar111._28_4_;
            auVar216._8_4_ = 0x80000000;
            auVar216._0_8_ = 0x8000000080000000;
            auVar216._12_4_ = 0x80000000;
            auVar216._16_4_ = 0x80000000;
            auVar216._20_4_ = 0x80000000;
            auVar216._24_4_ = 0x80000000;
            auVar216._28_4_ = 0x80000000;
            auVar117 = vxorps_avx512vl(auVar131,auVar216);
            auVar111 = auVar230._0_32_;
            auVar119 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar111);
            auVar229 = vfmadd231ps_fma(auVar119,auVar130,auVar130);
            auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar229));
            auVar225._8_4_ = 0xbf000000;
            auVar225._0_8_ = 0xbf000000bf000000;
            auVar225._12_4_ = 0xbf000000;
            auVar225._16_4_ = 0xbf000000;
            auVar225._20_4_ = 0xbf000000;
            auVar225._24_4_ = 0xbf000000;
            auVar225._28_4_ = 0xbf000000;
            fVar189 = auVar119._0_4_;
            fVar196 = auVar119._4_4_;
            fVar197 = auVar119._8_4_;
            fVar198 = auVar119._12_4_;
            fVar180 = auVar119._16_4_;
            fVar188 = auVar119._20_4_;
            fVar90 = auVar119._24_4_;
            auVar53._4_4_ = fVar196 * fVar196 * fVar196 * auVar229._4_4_ * -0.5;
            auVar53._0_4_ = fVar189 * fVar189 * fVar189 * auVar229._0_4_ * -0.5;
            auVar53._8_4_ = fVar197 * fVar197 * fVar197 * auVar229._8_4_ * -0.5;
            auVar53._12_4_ = fVar198 * fVar198 * fVar198 * auVar229._12_4_ * -0.5;
            auVar53._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar53._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar53._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
            auVar53._28_4_ = auVar130._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar119 = vfmadd231ps_avx512vl(auVar53,auVar115,auVar119);
            auVar54._4_4_ = auVar130._4_4_ * auVar119._4_4_;
            auVar54._0_4_ = auVar130._0_4_ * auVar119._0_4_;
            auVar54._8_4_ = auVar130._8_4_ * auVar119._8_4_;
            auVar54._12_4_ = auVar130._12_4_ * auVar119._12_4_;
            auVar54._16_4_ = auVar130._16_4_ * auVar119._16_4_;
            auVar54._20_4_ = auVar130._20_4_ * auVar119._20_4_;
            auVar54._24_4_ = auVar130._24_4_ * auVar119._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar119._4_4_ * -auVar129._4_4_;
            auVar55._0_4_ = auVar119._0_4_ * -auVar129._0_4_;
            auVar55._8_4_ = auVar119._8_4_ * -auVar129._8_4_;
            auVar55._12_4_ = auVar119._12_4_ * -auVar129._12_4_;
            auVar55._16_4_ = auVar119._16_4_ * -auVar129._16_4_;
            auVar55._20_4_ = auVar119._20_4_ * -auVar129._20_4_;
            auVar55._24_4_ = auVar119._24_4_ * -auVar129._24_4_;
            auVar55._28_4_ = auVar130._28_4_;
            auVar114 = vmulps_avx512vl(auVar119,auVar111);
            auVar119 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar111);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,auVar132);
            auVar113 = vrsqrt14ps_avx512vl(auVar119);
            auVar119 = vmulps_avx512vl(auVar119,auVar225);
            fVar189 = auVar113._0_4_;
            fVar196 = auVar113._4_4_;
            fVar197 = auVar113._8_4_;
            fVar198 = auVar113._12_4_;
            fVar180 = auVar113._16_4_;
            fVar188 = auVar113._20_4_;
            fVar90 = auVar113._24_4_;
            auVar56._4_4_ = fVar196 * fVar196 * fVar196 * auVar119._4_4_;
            auVar56._0_4_ = fVar189 * fVar189 * fVar189 * auVar119._0_4_;
            auVar56._8_4_ = fVar197 * fVar197 * fVar197 * auVar119._8_4_;
            auVar56._12_4_ = fVar198 * fVar198 * fVar198 * auVar119._12_4_;
            auVar56._16_4_ = fVar180 * fVar180 * fVar180 * auVar119._16_4_;
            auVar56._20_4_ = fVar188 * fVar188 * fVar188 * auVar119._20_4_;
            auVar56._24_4_ = fVar90 * fVar90 * fVar90 * auVar119._24_4_;
            auVar56._28_4_ = auVar119._28_4_;
            auVar119 = vfmadd231ps_avx512vl(auVar56,auVar115,auVar113);
            auVar57._4_4_ = auVar132._4_4_ * auVar119._4_4_;
            auVar57._0_4_ = auVar132._0_4_ * auVar119._0_4_;
            auVar57._8_4_ = auVar132._8_4_ * auVar119._8_4_;
            auVar57._12_4_ = auVar132._12_4_ * auVar119._12_4_;
            auVar57._16_4_ = auVar132._16_4_ * auVar119._16_4_;
            auVar57._20_4_ = auVar132._20_4_ * auVar119._20_4_;
            auVar57._24_4_ = auVar132._24_4_ * auVar119._24_4_;
            auVar57._28_4_ = auVar113._28_4_;
            auVar58._4_4_ = auVar119._4_4_ * auVar117._4_4_;
            auVar58._0_4_ = auVar119._0_4_ * auVar117._0_4_;
            auVar58._8_4_ = auVar119._8_4_ * auVar117._8_4_;
            auVar58._12_4_ = auVar119._12_4_ * auVar117._12_4_;
            auVar58._16_4_ = auVar119._16_4_ * auVar117._16_4_;
            auVar58._20_4_ = auVar119._20_4_ * auVar117._20_4_;
            auVar58._24_4_ = auVar119._24_4_ * auVar117._24_4_;
            auVar58._28_4_ = auVar117._28_4_;
            auVar117 = vmulps_avx512vl(auVar119,auVar111);
            auVar229 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar96),auVar106);
            auVar119 = ZEXT1632(auVar96);
            auVar23 = vfmadd213ps_fma(auVar55,auVar119,auVar108);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar119,auVar103);
            auVar113 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar95),auVar109);
            auVar28 = vfnmadd213ps_fma(auVar54,auVar119,auVar106);
            auVar104 = ZEXT1632(auVar95);
            auVar24 = vfmadd213ps_fma(auVar58,auVar104,auVar110);
            auVar97 = vfnmadd213ps_fma(auVar55,auVar119,auVar108);
            auVar25 = vfmadd213ps_fma(auVar117,auVar104,auVar102);
            auVar108 = ZEXT1632(auVar96);
            auVar33 = vfnmadd231ps_fma(auVar103,auVar108,auVar114);
            auVar98 = vfnmadd213ps_fma(auVar57,auVar104,auVar109);
            auVar32 = vfnmadd213ps_fma(auVar58,auVar104,auVar110);
            auVar99 = vfnmadd231ps_fma(auVar102,ZEXT1632(auVar95),auVar117);
            auVar102 = vsubps_avx512vl(auVar113,ZEXT1632(auVar28));
            auVar117 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar97));
            auVar119 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar33));
            auVar59._4_4_ = auVar117._4_4_ * auVar33._4_4_;
            auVar59._0_4_ = auVar117._0_4_ * auVar33._0_4_;
            auVar59._8_4_ = auVar117._8_4_ * auVar33._8_4_;
            auVar59._12_4_ = auVar117._12_4_ * auVar33._12_4_;
            auVar59._16_4_ = auVar117._16_4_ * 0.0;
            auVar59._20_4_ = auVar117._20_4_ * 0.0;
            auVar59._24_4_ = auVar117._24_4_ * 0.0;
            auVar59._28_4_ = auVar114._28_4_;
            auVar96 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar97),auVar119);
            auVar60._4_4_ = auVar119._4_4_ * auVar28._4_4_;
            auVar60._0_4_ = auVar119._0_4_ * auVar28._0_4_;
            auVar60._8_4_ = auVar119._8_4_ * auVar28._8_4_;
            auVar60._12_4_ = auVar119._12_4_ * auVar28._12_4_;
            auVar60._16_4_ = auVar119._16_4_ * 0.0;
            auVar60._20_4_ = auVar119._20_4_ * 0.0;
            auVar60._24_4_ = auVar119._24_4_ * 0.0;
            auVar60._28_4_ = auVar119._28_4_;
            auVar26 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar33),auVar102);
            auVar61._4_4_ = auVar97._4_4_ * auVar102._4_4_;
            auVar61._0_4_ = auVar97._0_4_ * auVar102._0_4_;
            auVar61._8_4_ = auVar97._8_4_ * auVar102._8_4_;
            auVar61._12_4_ = auVar97._12_4_ * auVar102._12_4_;
            auVar61._16_4_ = auVar102._16_4_ * 0.0;
            auVar61._20_4_ = auVar102._20_4_ * 0.0;
            auVar61._24_4_ = auVar102._24_4_ * 0.0;
            auVar61._28_4_ = auVar102._28_4_;
            auVar27 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar28),auVar117);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar27),auVar111,ZEXT1632(auVar26));
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar111,ZEXT1632(auVar96));
            uVar81 = vcmpps_avx512vl(auVar117,auVar111,2);
            bVar88 = (byte)uVar81;
            fVar142 = (float)((uint)(bVar88 & 1) * auVar229._0_4_ |
                             (uint)!(bool)(bVar88 & 1) * auVar98._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar144 = (float)((uint)bVar16 * auVar229._4_4_ | (uint)!bVar16 * auVar98._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar147 = (float)((uint)bVar16 * auVar229._8_4_ | (uint)!bVar16 * auVar98._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar148 = (float)((uint)bVar16 * auVar229._12_4_ | (uint)!bVar16 * auVar98._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar144,fVar142))));
            fVar143 = (float)((uint)(bVar88 & 1) * auVar23._0_4_ |
                             (uint)!(bool)(bVar88 & 1) * auVar32._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar146 = (float)((uint)bVar16 * auVar23._4_4_ | (uint)!bVar16 * auVar32._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar145 = (float)((uint)bVar16 * auVar23._8_4_ | (uint)!bVar16 * auVar32._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar149 = (float)((uint)bVar16 * auVar23._12_4_ | (uint)!bVar16 * auVar32._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar145,CONCAT44(fVar146,fVar143))));
            auVar133._0_4_ =
                 (float)((uint)(bVar88 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar99._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * auVar99._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * auVar99._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * auVar99._12_4_);
            fVar197 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_);
            auVar133._16_4_ = fVar197;
            fVar196 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_);
            auVar133._20_4_ = fVar196;
            fVar189 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_);
            auVar133._24_4_ = fVar189;
            iVar1 = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
            auVar133._28_4_ = iVar1;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar28),auVar113);
            auVar134._0_4_ =
                 (uint)(bVar88 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar96._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar96._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar96._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar96._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar24));
            auVar135._0_4_ =
                 (float)((uint)(bVar88 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar229._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar229._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar229._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar229._12_4_);
            fVar180 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
            auVar135._16_4_ = fVar180;
            fVar198 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
            auVar135._20_4_ = fVar198;
            fVar188 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
            auVar135._24_4_ = fVar188;
            auVar135._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar33),ZEXT1632(auVar25));
            auVar136._0_4_ =
                 (float)((uint)(bVar88 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar23._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar23._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar23._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar23._12_4_);
            fVar141 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
            auVar136._16_4_ = fVar141;
            fVar91 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
            auVar136._20_4_ = fVar91;
            fVar90 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
            auVar136._24_4_ = fVar90;
            iVar2 = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar88 & 1) * (int)auVar28._0_4_ |
                 (uint)!(bool)(bVar88 & 1) * auVar113._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar16 * (int)auVar28._4_4_ | (uint)!bVar16 * auVar113._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar16 * (int)auVar28._8_4_ | (uint)!bVar16 * auVar113._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar16 * (int)auVar28._12_4_ | (uint)!bVar16 * auVar113._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar113._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar113._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar113._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar113._28_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar113 = vsubps_avx512vl(auVar137,auVar104);
            auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar97._12_4_ |
                                                     (uint)!bVar20 * auVar24._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar97._8_4_ |
                                                              (uint)!bVar18 * auVar24._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar16 * auVar24._4_4_
                                                                       ,(uint)(bVar88 & 1) *
                                                                        (int)auVar97._0_4_ |
                                                                        (uint)!(bool)(bVar88 & 1) *
                                                                        auVar24._0_4_)))),auVar107);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar33._12_4_ |
                                                     (uint)!bVar21 * auVar25._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar33._8_4_ |
                                                              (uint)!bVar19 * auVar25._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar33._4_4_ |
                                                                       (uint)!bVar17 * auVar25._4_4_
                                                                       ,(uint)(bVar88 & 1) *
                                                                        (int)auVar33._0_4_ |
                                                                        (uint)!(bool)(bVar88 & 1) *
                                                                        auVar25._0_4_)))),auVar133);
            auVar114 = vsubps_avx(auVar104,auVar134);
            auVar102 = vsubps_avx(auVar107,auVar135);
            auVar103 = vsubps_avx(auVar133,auVar136);
            auVar62._4_4_ = auVar115._4_4_ * fVar144;
            auVar62._0_4_ = auVar115._0_4_ * fVar142;
            auVar62._8_4_ = auVar115._8_4_ * fVar147;
            auVar62._12_4_ = auVar115._12_4_ * fVar148;
            auVar62._16_4_ = auVar115._16_4_ * 0.0;
            auVar62._20_4_ = auVar115._20_4_ * 0.0;
            auVar62._24_4_ = auVar115._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar62,auVar133,auVar113);
            auVar187._0_4_ = fVar143 * auVar113._0_4_;
            auVar187._4_4_ = fVar146 * auVar113._4_4_;
            auVar187._8_4_ = fVar145 * auVar113._8_4_;
            auVar187._12_4_ = fVar149 * auVar113._12_4_;
            auVar187._16_4_ = auVar113._16_4_ * 0.0;
            auVar187._20_4_ = auVar113._20_4_ * 0.0;
            auVar187._24_4_ = auVar113._24_4_ * 0.0;
            auVar187._28_4_ = 0;
            auVar229 = vfmsub231ps_fma(auVar187,auVar104,auVar119);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar229),auVar111,ZEXT1632(auVar96));
            auVar194._0_4_ = auVar119._0_4_ * auVar133._0_4_;
            auVar194._4_4_ = auVar119._4_4_ * auVar133._4_4_;
            auVar194._8_4_ = auVar119._8_4_ * auVar133._8_4_;
            auVar194._12_4_ = auVar119._12_4_ * auVar133._12_4_;
            auVar194._16_4_ = auVar119._16_4_ * fVar197;
            auVar194._20_4_ = auVar119._20_4_ * fVar196;
            auVar194._24_4_ = auVar119._24_4_ * fVar189;
            auVar194._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar194,auVar107,auVar115);
            auVar105 = vfmadd231ps_avx512vl(auVar117,auVar111,ZEXT1632(auVar96));
            auVar117 = vmulps_avx512vl(auVar103,auVar134);
            auVar117 = vfmsub231ps_avx512vl(auVar117,auVar114,auVar136);
            auVar63._4_4_ = auVar102._4_4_ * auVar136._4_4_;
            auVar63._0_4_ = auVar102._0_4_ * auVar136._0_4_;
            auVar63._8_4_ = auVar102._8_4_ * auVar136._8_4_;
            auVar63._12_4_ = auVar102._12_4_ * auVar136._12_4_;
            auVar63._16_4_ = auVar102._16_4_ * fVar141;
            auVar63._20_4_ = auVar102._20_4_ * fVar91;
            auVar63._24_4_ = auVar102._24_4_ * fVar90;
            auVar63._28_4_ = iVar2;
            auVar96 = vfmsub231ps_fma(auVar63,auVar135,auVar103);
            auVar195._0_4_ = auVar135._0_4_ * auVar114._0_4_;
            auVar195._4_4_ = auVar135._4_4_ * auVar114._4_4_;
            auVar195._8_4_ = auVar135._8_4_ * auVar114._8_4_;
            auVar195._12_4_ = auVar135._12_4_ * auVar114._12_4_;
            auVar195._16_4_ = fVar180 * auVar114._16_4_;
            auVar195._20_4_ = fVar198 * auVar114._20_4_;
            auVar195._24_4_ = fVar188 * auVar114._24_4_;
            auVar195._28_4_ = 0;
            auVar229 = vfmsub231ps_fma(auVar195,auVar102,auVar134);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar229),auVar111,auVar117);
            auVar106 = vfmadd231ps_avx512vl(auVar117,auVar111,ZEXT1632(auVar96));
            auVar117 = vmaxps_avx(auVar105,auVar106);
            uVar151 = vcmpps_avx512vl(auVar117,auVar111,2);
            local_2f0 = local_2f0 & (byte)uVar151;
            if (local_2f0 == 0) {
LAB_01c828f6:
              local_2f0 = 0;
            }
            else {
              auVar64._4_4_ = auVar103._4_4_ * auVar119._4_4_;
              auVar64._0_4_ = auVar103._0_4_ * auVar119._0_4_;
              auVar64._8_4_ = auVar103._8_4_ * auVar119._8_4_;
              auVar64._12_4_ = auVar103._12_4_ * auVar119._12_4_;
              auVar64._16_4_ = auVar103._16_4_ * auVar119._16_4_;
              auVar64._20_4_ = auVar103._20_4_ * auVar119._20_4_;
              auVar64._24_4_ = auVar103._24_4_ * auVar119._24_4_;
              auVar64._28_4_ = auVar117._28_4_;
              auVar23 = vfmsub231ps_fma(auVar64,auVar102,auVar115);
              auVar65._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar65._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar65._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar65._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar65._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar65._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar65._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar65._28_4_ = auVar115._28_4_;
              auVar229 = vfmsub231ps_fma(auVar65,auVar113,auVar103);
              auVar66._4_4_ = auVar102._4_4_ * auVar113._4_4_;
              auVar66._0_4_ = auVar102._0_4_ * auVar113._0_4_;
              auVar66._8_4_ = auVar102._8_4_ * auVar113._8_4_;
              auVar66._12_4_ = auVar102._12_4_ * auVar113._12_4_;
              auVar66._16_4_ = auVar102._16_4_ * auVar113._16_4_;
              auVar66._20_4_ = auVar102._20_4_ * auVar113._20_4_;
              auVar66._24_4_ = auVar102._24_4_ * auVar113._24_4_;
              auVar66._28_4_ = auVar102._28_4_;
              auVar24 = vfmsub231ps_fma(auVar66,auVar114,auVar119);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar229),ZEXT1632(auVar24));
              auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar23),auVar111);
              auVar119 = vrcp14ps_avx512vl(auVar117);
              auVar39._8_4_ = 0x3f800000;
              auVar39._0_8_ = &DAT_3f8000003f800000;
              auVar39._12_4_ = 0x3f800000;
              auVar39._16_4_ = 0x3f800000;
              auVar39._20_4_ = 0x3f800000;
              auVar39._24_4_ = 0x3f800000;
              auVar39._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar119,auVar117,auVar39);
              auVar96 = vfmadd132ps_fma(auVar115,auVar119,auVar119);
              auVar67._4_4_ = auVar24._4_4_ * auVar133._4_4_;
              auVar67._0_4_ = auVar24._0_4_ * auVar133._0_4_;
              auVar67._8_4_ = auVar24._8_4_ * auVar133._8_4_;
              auVar67._12_4_ = auVar24._12_4_ * auVar133._12_4_;
              auVar67._16_4_ = fVar197 * 0.0;
              auVar67._20_4_ = fVar196 * 0.0;
              auVar67._24_4_ = fVar189 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar229 = vfmadd231ps_fma(auVar67,auVar107,ZEXT1632(auVar229));
              auVar229 = vfmadd231ps_fma(ZEXT1632(auVar229),auVar104,ZEXT1632(auVar23));
              fVar189 = auVar96._0_4_;
              fVar196 = auVar96._4_4_;
              fVar197 = auVar96._8_4_;
              fVar198 = auVar96._12_4_;
              auVar119 = ZEXT1632(CONCAT412(auVar229._12_4_ * fVar198,
                                            CONCAT48(auVar229._8_4_ * fVar197,
                                                     CONCAT44(auVar229._4_4_ * fVar196,
                                                              auVar229._0_4_ * fVar189))));
              auVar78._4_4_ = uStack_3bc;
              auVar78._0_4_ = local_3c0;
              auVar78._8_4_ = uStack_3b8;
              auVar78._12_4_ = uStack_3b4;
              auVar78._16_4_ = uStack_3b0;
              auVar78._20_4_ = uStack_3ac;
              auVar78._24_4_ = uStack_3a8;
              auVar78._28_4_ = uStack_3a4;
              uVar151 = vcmpps_avx512vl(auVar119,auVar78,0xd);
              uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar40._4_4_ = uVar150;
              auVar40._0_4_ = uVar150;
              auVar40._8_4_ = uVar150;
              auVar40._12_4_ = uVar150;
              auVar40._16_4_ = uVar150;
              auVar40._20_4_ = uVar150;
              auVar40._24_4_ = uVar150;
              auVar40._28_4_ = uVar150;
              uVar29 = vcmpps_avx512vl(auVar119,auVar40,2);
              local_2f0 = (byte)uVar151 & (byte)uVar29 & local_2f0;
              if (local_2f0 == 0) goto LAB_01c828f6;
              uVar151 = vcmpps_avx512vl(auVar117,auVar111,4);
              if ((local_2f0 & (byte)uVar151) == 0) {
                local_2f0 = 0;
              }
              else {
                local_2f0 = local_2f0 & (byte)uVar151;
                fVar180 = auVar105._0_4_ * fVar189;
                fVar188 = auVar105._4_4_ * fVar196;
                auVar68._4_4_ = fVar188;
                auVar68._0_4_ = fVar180;
                fVar90 = auVar105._8_4_ * fVar197;
                auVar68._8_4_ = fVar90;
                fVar91 = auVar105._12_4_ * fVar198;
                auVar68._12_4_ = fVar91;
                fVar141 = auVar105._16_4_ * 0.0;
                auVar68._16_4_ = fVar141;
                fVar142 = auVar105._20_4_ * 0.0;
                auVar68._20_4_ = fVar142;
                fVar143 = auVar105._24_4_ * 0.0;
                auVar68._24_4_ = fVar143;
                auVar68._28_4_ = auVar105._28_4_;
                fVar189 = auVar106._0_4_ * fVar189;
                fVar196 = auVar106._4_4_ * fVar196;
                auVar69._4_4_ = fVar196;
                auVar69._0_4_ = fVar189;
                fVar197 = auVar106._8_4_ * fVar197;
                auVar69._8_4_ = fVar197;
                fVar198 = auVar106._12_4_ * fVar198;
                auVar69._12_4_ = fVar198;
                fVar144 = auVar106._16_4_ * 0.0;
                auVar69._16_4_ = fVar144;
                fVar146 = auVar106._20_4_ * 0.0;
                auVar69._20_4_ = fVar146;
                fVar147 = auVar106._24_4_ * 0.0;
                auVar69._24_4_ = fVar147;
                auVar69._28_4_ = auVar106._28_4_;
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = &DAT_3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar207,auVar68);
                local_5e0._0_4_ =
                     (uint)(bVar88 & 1) * (int)fVar180 | (uint)!(bool)(bVar88 & 1) * auVar117._0_4_;
                bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
                local_5e0._4_4_ = (uint)bVar16 * (int)fVar188 | (uint)!bVar16 * auVar117._4_4_;
                bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
                local_5e0._8_4_ = (uint)bVar16 * (int)fVar90 | (uint)!bVar16 * auVar117._8_4_;
                bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
                local_5e0._12_4_ = (uint)bVar16 * (int)fVar91 | (uint)!bVar16 * auVar117._12_4_;
                bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
                local_5e0._16_4_ = (uint)bVar16 * (int)fVar141 | (uint)!bVar16 * auVar117._16_4_;
                bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                local_5e0._20_4_ = (uint)bVar16 * (int)fVar142 | (uint)!bVar16 * auVar117._20_4_;
                bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
                local_5e0._24_4_ = (uint)bVar16 * (int)fVar143 | (uint)!bVar16 * auVar117._24_4_;
                bVar16 = SUB81(uVar81 >> 7,0);
                local_5e0._28_4_ = (uint)bVar16 * auVar105._28_4_ | (uint)!bVar16 * auVar117._28_4_;
                auVar117 = vsubps_avx(auVar207,auVar69);
                bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar81 >> 6) & 1);
                bVar22 = SUB81(uVar81 >> 7,0);
                local_1c0._4_4_ = (uint)bVar16 * (int)fVar196 | (uint)!bVar16 * auVar117._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar88 & 1) * (int)fVar189 | (uint)!(bool)(bVar88 & 1) * auVar117._0_4_;
                local_1c0._8_4_ = (uint)bVar17 * (int)fVar197 | (uint)!bVar17 * auVar117._8_4_;
                local_1c0._12_4_ = (uint)bVar18 * (int)fVar198 | (uint)!bVar18 * auVar117._12_4_;
                local_1c0._16_4_ = (uint)bVar19 * (int)fVar144 | (uint)!bVar19 * auVar117._16_4_;
                local_1c0._20_4_ = (uint)bVar20 * (int)fVar146 | (uint)!bVar20 * auVar117._20_4_;
                local_1c0._24_4_ = (uint)bVar21 * (int)fVar147 | (uint)!bVar21 * auVar117._24_4_;
                local_1c0._28_4_ = (uint)bVar22 * auVar106._28_4_ | (uint)!bVar22 * auVar117._28_4_;
                local_600 = auVar119;
              }
            }
            auVar227 = ZEXT3264(local_400);
            if (local_2f0 != 0) {
              auVar117 = vsubps_avx(ZEXT1632(auVar95),auVar108);
              auVar96 = vfmadd213ps_fma(auVar117,local_5e0,auVar108);
              uVar150 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
              auVar41._4_4_ = uVar150;
              auVar41._0_4_ = uVar150;
              auVar41._8_4_ = uVar150;
              auVar41._12_4_ = uVar150;
              auVar41._16_4_ = uVar150;
              auVar41._20_4_ = uVar150;
              auVar41._24_4_ = uVar150;
              auVar41._28_4_ = uVar150;
              auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar41);
              uVar151 = vcmpps_avx512vl(local_600,auVar117,6);
              local_2f0 = local_2f0 & (byte)uVar151;
              if (local_2f0 != 0) {
                auVar162._8_4_ = 0xbf800000;
                auVar162._0_8_ = 0xbf800000bf800000;
                auVar162._12_4_ = 0xbf800000;
                auVar162._16_4_ = 0xbf800000;
                auVar162._20_4_ = 0xbf800000;
                auVar162._24_4_ = 0xbf800000;
                auVar162._28_4_ = 0xbf800000;
                auVar42._8_4_ = 0x40000000;
                auVar42._0_8_ = 0x4000000040000000;
                auVar42._12_4_ = 0x40000000;
                auVar42._16_4_ = 0x40000000;
                auVar42._20_4_ = 0x40000000;
                auVar42._24_4_ = 0x40000000;
                auVar42._28_4_ = 0x40000000;
                local_380 = vfmadd132ps_avx512vl(local_1c0,auVar162,auVar42);
                local_1c0 = local_380;
                auVar117 = local_1c0;
                local_340 = (undefined4)lVar84;
                local_330 = local_690._0_8_;
                uStack_328 = local_690._8_8_;
                local_320 = local_620._0_8_;
                uStack_318 = local_620._8_8_;
                local_310 = local_630._0_8_;
                uStack_308 = local_630._8_8_;
                local_300 = local_610;
                uStack_2f8 = uStack_608;
                pGVar11 = (context->scene->geometries).items[uVar7].ptr;
                local_6a0._0_8_ = pGVar11;
                local_1c0 = auVar117;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar96 = vcvtsi2ss_avx512f(auVar237._0_16_,local_340);
                  fVar189 = auVar96._0_4_;
                  local_2e0[0] = (fVar189 + local_5e0._0_4_ + 0.0) * local_1e0;
                  local_2e0[1] = (fVar189 + local_5e0._4_4_ + 1.0) * fStack_1dc;
                  local_2e0[2] = (fVar189 + local_5e0._8_4_ + 2.0) * fStack_1d8;
                  local_2e0[3] = (fVar189 + local_5e0._12_4_ + 3.0) * fStack_1d4;
                  fStack_2d0 = (fVar189 + local_5e0._16_4_ + 4.0) * fStack_1d0;
                  fStack_2cc = (fVar189 + local_5e0._20_4_ + 5.0) * fStack_1cc;
                  fStack_2c8 = (fVar189 + local_5e0._24_4_ + 6.0) * fStack_1c8;
                  fStack_2c4 = fVar189 + local_5e0._28_4_ + 7.0;
                  local_1c0._0_8_ = local_380._0_8_;
                  local_1c0._8_8_ = local_380._8_8_;
                  local_1c0._16_8_ = local_380._16_8_;
                  local_1c0._24_8_ = local_380._24_8_;
                  local_2c0 = local_1c0._0_8_;
                  uStack_2b8 = local_1c0._8_8_;
                  uStack_2b0 = local_1c0._16_8_;
                  uStack_2a8 = local_1c0._24_8_;
                  local_2a0 = local_600;
                  auVar163._8_4_ = 0x7f800000;
                  auVar163._0_8_ = 0x7f8000007f800000;
                  auVar163._12_4_ = 0x7f800000;
                  auVar163._16_4_ = 0x7f800000;
                  auVar163._20_4_ = 0x7f800000;
                  auVar163._24_4_ = 0x7f800000;
                  auVar163._28_4_ = 0x7f800000;
                  auVar117 = vblendmps_avx512vl(auVar163,local_600);
                  auVar138._0_4_ =
                       (uint)(local_2f0 & 1) * auVar117._0_4_ |
                       (uint)!(bool)(local_2f0 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 1 & 1);
                  auVar138._4_4_ = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 2 & 1);
                  auVar138._8_4_ = (uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 3 & 1);
                  auVar138._12_4_ = (uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 4 & 1);
                  auVar138._16_4_ = (uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 5 & 1);
                  auVar138._20_4_ = (uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_2f0 >> 6 & 1);
                  auVar138._24_4_ = (uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar138._28_4_ =
                       (uint)(local_2f0 >> 7) * auVar117._28_4_ |
                       (uint)!(bool)(local_2f0 >> 7) * 0x7f800000;
                  auVar117 = vshufps_avx(auVar138,auVar138,0xb1);
                  auVar117 = vminps_avx(auVar138,auVar117);
                  auVar119 = vshufpd_avx(auVar117,auVar117,5);
                  auVar117 = vminps_avx(auVar117,auVar119);
                  auVar119 = vpermpd_avx2(auVar117,0x4e);
                  auVar117 = vminps_avx(auVar117,auVar119);
                  uVar151 = vcmpps_avx512vl(auVar138,auVar117,0);
                  bVar80 = (byte)uVar151 & local_2f0;
                  bVar88 = local_2f0;
                  if (bVar80 != 0) {
                    bVar88 = bVar80;
                  }
                  uVar85 = 0;
                  for (uVar83 = (uint)bVar88; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000)
                  {
                    uVar85 = uVar85 + 1;
                  }
                  uVar81 = (ulong)uVar85;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar189 = local_2e0[uVar81];
                    uVar150 = *(undefined4 *)((long)&local_2c0 + uVar81 * 4);
                    fVar197 = 1.0 - fVar189;
                    fVar196 = fVar197 * fVar197 * -3.0;
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),
                                              ZEXT416((uint)(fVar189 * fVar197)),ZEXT416(0xc0000000)
                                             );
                    auVar95 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar197)),
                                              ZEXT416((uint)(fVar189 * fVar189)),ZEXT416(0x40000000)
                                             );
                    fVar197 = auVar96._0_4_ * 3.0;
                    fVar198 = auVar95._0_4_ * 3.0;
                    fVar180 = fVar189 * fVar189 * 3.0;
                    auVar203._0_4_ = fVar180 * (float)local_610._0_4_;
                    auVar203._4_4_ = fVar180 * (float)local_610._4_4_;
                    auVar203._8_4_ = fVar180 * (float)uStack_608;
                    auVar203._12_4_ = fVar180 * uStack_608._4_4_;
                    auVar178._4_4_ = fVar198;
                    auVar178._0_4_ = fVar198;
                    auVar178._8_4_ = fVar198;
                    auVar178._12_4_ = fVar198;
                    auVar96 = vfmadd132ps_fma(auVar178,auVar203,local_630);
                    auVar184._4_4_ = fVar197;
                    auVar184._0_4_ = fVar197;
                    auVar184._8_4_ = fVar197;
                    auVar184._12_4_ = fVar197;
                    auVar96 = vfmadd132ps_fma(auVar184,auVar96,local_620);
                    auVar179._4_4_ = fVar196;
                    auVar179._0_4_ = fVar196;
                    auVar179._8_4_ = fVar196;
                    auVar179._12_4_ = fVar196;
                    auVar96 = vfmadd132ps_fma(auVar179,auVar96,local_690);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar81 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar96._0_4_;
                    uVar10 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                    uVar10 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                    *(float *)(ray + k * 4 + 0xf0) = fVar189;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                    *(uint *)(ray + k * 4 + 0x110) = uVar8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar7;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_570 = local_620._0_4_;
                    fStack_56c = local_620._4_4_;
                    fStack_568 = local_620._8_4_;
                    fStack_564 = local_620._12_4_;
                    local_650 = local_630;
                    local_180 = local_610;
                    uStack_178 = uStack_608;
                    local_160 = vmovdqa64_avx512vl(auVar237._0_32_);
                    local_3a0 = local_5e0;
                    local_360 = local_600;
                    local_33c = iVar9;
                    bVar88 = local_2f0;
                    do {
                      auVar229 = auVar230._0_16_;
                      local_560 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_240 = local_2e0[uVar81];
                      local_230 = *(undefined4 *)((long)&local_2c0 + uVar81 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar81 * 4);
                      local_680.context = context->user;
                      fVar196 = 1.0 - local_240;
                      fVar189 = fVar196 * fVar196 * -3.0;
                      auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                                ZEXT416((uint)(local_240 * fVar196)),
                                                ZEXT416(0xc0000000));
                      auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar196)),
                                                ZEXT416((uint)(local_240 * local_240)),
                                                ZEXT416(0x40000000));
                      fVar196 = auVar96._0_4_ * 3.0;
                      fVar197 = auVar95._0_4_ * 3.0;
                      fVar198 = local_240 * local_240 * 3.0;
                      auVar204._0_4_ = fVar198 * (float)local_180;
                      auVar204._4_4_ = fVar198 * local_180._4_4_;
                      auVar204._8_4_ = fVar198 * (float)uStack_178;
                      auVar204._12_4_ = fVar198 * uStack_178._4_4_;
                      auVar156._4_4_ = fVar197;
                      auVar156._0_4_ = fVar197;
                      auVar156._8_4_ = fVar197;
                      auVar156._12_4_ = fVar197;
                      auVar96 = vfmadd132ps_fma(auVar156,auVar204,local_650);
                      auVar185._4_4_ = fVar196;
                      auVar185._0_4_ = fVar196;
                      auVar185._8_4_ = fVar196;
                      auVar185._12_4_ = fVar196;
                      auVar76._4_4_ = fStack_56c;
                      auVar76._0_4_ = local_570;
                      auVar76._8_4_ = fStack_568;
                      auVar76._12_4_ = fStack_564;
                      auVar96 = vfmadd132ps_fma(auVar185,auVar96,auVar76);
                      auVar157._4_4_ = fVar189;
                      auVar157._0_4_ = fVar189;
                      auVar157._8_4_ = fVar189;
                      auVar157._12_4_ = fVar189;
                      auVar96 = vfmadd132ps_fma(auVar157,auVar96,local_690);
                      local_270 = auVar96._0_4_;
                      local_260 = vshufps_avx(auVar96,auVar96,0x55);
                      local_250 = vshufps_avx(auVar96,auVar96,0xaa);
                      iStack_26c = local_270;
                      iStack_268 = local_270;
                      iStack_264 = local_270;
                      fStack_23c = local_240;
                      fStack_238 = local_240;
                      fStack_234 = local_240;
                      uStack_22c = local_230;
                      uStack_228 = local_230;
                      uStack_224 = local_230;
                      local_220 = local_550._0_8_;
                      uStack_218 = local_550._8_8_;
                      local_210 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_1fc = (local_680.context)->instID[0];
                      local_200 = uStack_1fc;
                      uStack_1f8 = uStack_1fc;
                      uStack_1f4 = uStack_1fc;
                      uStack_1f0 = (local_680.context)->instPrimID[0];
                      uStack_1ec = uStack_1f0;
                      uStack_1e8 = uStack_1f0;
                      uStack_1e4 = uStack_1f0;
                      local_6c0 = local_3d0._0_8_;
                      uStack_6b8 = local_3d0._8_8_;
                      local_680.valid = (int *)&local_6c0;
                      local_680.geometryUserPtr = *(void **)(local_6a0._0_8_ + 0x18);
                      local_680.hit = (RTCHitN *)&local_270;
                      local_680.N = 4;
                      local_640 = (uint)bVar88;
                      local_680.ray = (RTCRayN *)ray;
                      if (*(code **)(local_6a0._0_8_ + 0x40) != (code *)0x0) {
                        (**(code **)(local_6a0._0_8_ + 0x40))(&local_680);
                        auVar117 = vmovdqa64_avx512vl(local_160);
                        auVar237 = ZEXT3264(auVar117);
                        auVar236 = ZEXT3264(local_460);
                        auVar235 = ZEXT3264(local_440);
                        auVar234 = ZEXT3264(local_4e0);
                        auVar233 = ZEXT3264(local_4c0);
                        auVar232 = ZEXT3264(local_420);
                        auVar231 = ZEXT3264(local_4a0);
                        auVar227 = ZEXT3264(local_400);
                        auVar228 = ZEXT3264(local_480);
                        auVar96 = vxorps_avx512vl(auVar229,auVar229);
                        auVar230 = ZEXT1664(auVar96);
                      }
                      bVar80 = (byte)local_640;
                      auVar96 = auVar230._0_16_;
                      auVar71._8_8_ = uStack_6b8;
                      auVar71._0_8_ = local_6c0;
                      uVar89 = vptestmd_avx512vl(auVar71,auVar71);
                      if ((uVar89 & 0xf) == 0) {
LAB_01c82d4e:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_560;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_6a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          (*p_Var15)(&local_680);
                          bVar80 = (byte)local_640;
                          auVar117 = vmovdqa64_avx512vl(local_160);
                          auVar237 = ZEXT3264(auVar117);
                          auVar236 = ZEXT3264(local_460);
                          auVar235 = ZEXT3264(local_440);
                          auVar234 = ZEXT3264(local_4e0);
                          auVar233 = ZEXT3264(local_4c0);
                          auVar232 = ZEXT3264(local_420);
                          auVar231 = ZEXT3264(local_4a0);
                          auVar227 = ZEXT3264(local_400);
                          auVar228 = ZEXT3264(local_480);
                          auVar96 = vxorps_avx512vl(auVar96,auVar96);
                          auVar230 = ZEXT1664(auVar96);
                        }
                        auVar72._8_8_ = uStack_6b8;
                        auVar72._0_8_ = local_6c0;
                        uVar89 = vptestmd_avx512vl(auVar72,auVar72);
                        uVar89 = uVar89 & 0xf;
                        bVar88 = (byte)uVar89;
                        if (bVar88 == 0) goto LAB_01c82d4e;
                        iVar1 = *(int *)(local_680.hit + 4);
                        iVar2 = *(int *)(local_680.hit + 8);
                        iVar70 = *(int *)(local_680.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar18 = SUB81(uVar89 >> 3,0);
                        *(uint *)(local_680.ray + 0xc0) =
                             (uint)(bVar88 & 1) * *(int *)local_680.hit |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_680.ray + 0xc0);
                        *(uint *)(local_680.ray + 0xc4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xc4);
                        *(uint *)(local_680.ray + 200) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 200);
                        *(uint *)(local_680.ray + 0xcc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xcc);
                        iVar1 = *(int *)(local_680.hit + 0x14);
                        iVar2 = *(int *)(local_680.hit + 0x18);
                        iVar70 = *(int *)(local_680.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar18 = SUB81(uVar89 >> 3,0);
                        *(uint *)(local_680.ray + 0xd0) =
                             (uint)(bVar88 & 1) * *(int *)(local_680.hit + 0x10) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_680.ray + 0xd0);
                        *(uint *)(local_680.ray + 0xd4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xd4);
                        *(uint *)(local_680.ray + 0xd8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xd8);
                        *(uint *)(local_680.ray + 0xdc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xdc);
                        iVar1 = *(int *)(local_680.hit + 0x24);
                        iVar2 = *(int *)(local_680.hit + 0x28);
                        iVar70 = *(int *)(local_680.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar18 = SUB81(uVar89 >> 3,0);
                        *(uint *)(local_680.ray + 0xe0) =
                             (uint)(bVar88 & 1) * *(int *)(local_680.hit + 0x20) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_680.ray + 0xe0);
                        *(uint *)(local_680.ray + 0xe4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xe4);
                        *(uint *)(local_680.ray + 0xe8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xe8);
                        *(uint *)(local_680.ray + 0xec) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xec);
                        iVar1 = *(int *)(local_680.hit + 0x34);
                        iVar2 = *(int *)(local_680.hit + 0x38);
                        iVar70 = *(int *)(local_680.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar18 = SUB81(uVar89 >> 3,0);
                        *(uint *)(local_680.ray + 0xf0) =
                             (uint)(bVar88 & 1) * *(int *)(local_680.hit + 0x30) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_680.ray + 0xf0);
                        *(uint *)(local_680.ray + 0xf4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_680.ray + 0xf4);
                        *(uint *)(local_680.ray + 0xf8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_680.ray + 0xf8);
                        *(uint *)(local_680.ray + 0xfc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_680.ray + 0xfc);
                        auVar96 = *(undefined1 (*) [16])(local_680.ray + 0x100);
                        auVar100._0_4_ =
                             (uint)(bVar88 & 1) * *(int *)(local_680.hit + 0x40) |
                             (uint)!(bool)(bVar88 & 1) * auVar96._0_4_;
                        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                        auVar100._4_4_ =
                             (uint)bVar16 * *(int *)(local_680.hit + 0x44) |
                             (uint)!bVar16 * auVar96._4_4_;
                        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                        auVar100._8_4_ =
                             (uint)bVar16 * *(int *)(local_680.hit + 0x48) |
                             (uint)!bVar16 * auVar96._8_4_;
                        bVar16 = SUB81(uVar89 >> 3,0);
                        auVar100._12_4_ =
                             (uint)bVar16 * *(int *)(local_680.hit + 0x4c) |
                             (uint)!bVar16 * auVar96._12_4_;
                        *(undefined1 (*) [16])(local_680.ray + 0x100) = auVar100;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x50));
                        *(undefined1 (*) [16])(local_680.ray + 0x110) = auVar96;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x60));
                        *(undefined1 (*) [16])(local_680.ray + 0x120) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x70));
                        *(undefined1 (*) [16])(local_680.ray + 0x130) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_680.hit + 0x80));
                        *(undefined1 (*) [16])(local_680.ray + 0x140) = auVar96;
                      }
                      bVar80 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & bVar80;
                      uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar43._4_4_ = uVar150;
                      auVar43._0_4_ = uVar150;
                      auVar43._8_4_ = uVar150;
                      auVar43._12_4_ = uVar150;
                      auVar43._16_4_ = uVar150;
                      auVar43._20_4_ = uVar150;
                      auVar43._24_4_ = uVar150;
                      auVar43._28_4_ = uVar150;
                      uVar151 = vcmpps_avx512vl(local_600,auVar43,2);
                      bVar88 = bVar80 & (byte)uVar151;
                      if ((bVar80 & (byte)uVar151) != 0) {
                        auVar164._8_4_ = 0x7f800000;
                        auVar164._0_8_ = 0x7f8000007f800000;
                        auVar164._12_4_ = 0x7f800000;
                        auVar164._16_4_ = 0x7f800000;
                        auVar164._20_4_ = 0x7f800000;
                        auVar164._24_4_ = 0x7f800000;
                        auVar164._28_4_ = 0x7f800000;
                        auVar117 = vblendmps_avx512vl(auVar164,local_600);
                        auVar139._0_4_ =
                             (uint)(bVar88 & 1) * auVar117._0_4_ |
                             (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 1 & 1);
                        auVar139._4_4_ = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 2 & 1);
                        auVar139._8_4_ = (uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 3 & 1);
                        auVar139._12_4_ =
                             (uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 4 & 1);
                        auVar139._16_4_ =
                             (uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 5 & 1);
                        auVar139._20_4_ =
                             (uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar88 >> 6 & 1);
                        auVar139._24_4_ =
                             (uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar139._28_4_ =
                             (uint)(bVar88 >> 7) * auVar117._28_4_ |
                             (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
                        auVar117 = vshufps_avx(auVar139,auVar139,0xb1);
                        auVar117 = vminps_avx(auVar139,auVar117);
                        auVar119 = vshufpd_avx(auVar117,auVar117,5);
                        auVar117 = vminps_avx(auVar117,auVar119);
                        auVar119 = vpermpd_avx2(auVar117,0x4e);
                        auVar117 = vminps_avx(auVar117,auVar119);
                        uVar151 = vcmpps_avx512vl(auVar139,auVar117,0);
                        bVar79 = (byte)uVar151 & bVar88;
                        bVar80 = bVar88;
                        if (bVar79 != 0) {
                          bVar80 = bVar79;
                        }
                        uVar85 = 0;
                        for (uVar83 = (uint)bVar80; (uVar83 & 1) == 0;
                            uVar83 = uVar83 >> 1 | 0x80000000) {
                          uVar85 = uVar85 + 1;
                        }
                        uVar81 = (ulong)uVar85;
                      }
                    } while (bVar88 != 0);
                  }
                }
              }
            }
          }
          lVar84 = lVar84 + 8;
        } while ((int)lVar84 < iVar9);
      }
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar150;
      auVar35._0_4_ = uVar150;
      auVar35._8_4_ = uVar150;
      auVar35._12_4_ = uVar150;
      uVar151 = vcmpps_avx512vl(local_170,auVar35,2);
      uVar85 = (uint)uVar87 & (uint)uVar87 + 0xf & (uint)uVar151;
      uVar87 = (ulong)uVar85;
    } while (uVar85 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }